

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O2

long __thiscall gl4cts::anon_unknown_0::BasicAllTargetsStore::Run(BasicAllTargetsStore *this)

{
  GLuint *vao;
  CallLogWrapper *this_00;
  long lVar1;
  pointer pVVar2;
  _func_int **pp_Var3;
  bool bVar4;
  GLuint GVar5;
  GLuint program;
  GLint GVar6;
  ostream *poVar7;
  int iVar8;
  Vector<float,_4> *expected_value;
  GLenum e;
  GLenum e_00;
  GLenum e_01;
  GLenum e_02;
  GLenum e_03;
  GLenum e_04;
  GLenum e_05;
  GLenum e_06;
  GLenum e_07;
  Vector<float,_4> *v;
  Vector<float,_4> *v_00;
  Vector<int,_4> *v_01;
  Vector<int,_4> *v_02;
  Vector<unsigned_int,_4> *v_03;
  Vector<unsigned_int,_4> *v_04;
  long lVar9;
  pointer pVVar10;
  char *pcVar11;
  long lVar12;
  vec4 *pvVar13;
  Vector<float,_4> local_408;
  Vector<float,_4> local_3f8;
  GLuint textures_3 [2];
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> data;
  string local_3a8;
  GLuint textures [1];
  string local_358;
  string local_338;
  string local_318;
  string local_2f8;
  string local_2d8;
  string local_2b8;
  string local_298;
  string local_278;
  string local_258;
  string local_238;
  string local_218;
  string local_1f8;
  Vector<float,_4> local_1d8 [2];
  GLint isamples;
  ostringstream os;
  
  vao = &this->m_vao;
  expected_value = (Vector<float,_4> *)0x0;
  ShaderImageLoadStoreBase::CreateFullViewportQuad
            (&this->super_ShaderImageLoadStoreBase,vao,&this->m_vbo,(GLuint *)0x0);
  os.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)0x40000000bf800000;
  os.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = 0xc080000040400000;
  textures_3[0] = 0xbf800000;
  textures_3[1] = 0x40000000;
  bVar4 = gl4cts::(anonymous_namespace)::BasicAllTargetsStore::Write<tcu::Vector<float,4>>
                    ((BasicAllTargetsStore *)this,(GLenum)&os,(Vector<float,_4> *)textures_3,
                     expected_value);
  if (!bVar4) {
    return -1;
  }
  os.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)0xfffffffe00000001;
  os.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = 0xfffffffc00000003;
  textures_3[0] = 1;
  textures_3[1] = 0xfffffffe;
  bVar4 = gl4cts::(anonymous_namespace)::BasicAllTargetsStore::Write<tcu::Vector<int,4>>
                    ((BasicAllTargetsStore *)this,(GLenum)&os,(Vector<int,_4> *)textures_3,
                     (Vector<int,_4> *)expected_value);
  if (!bVar4) {
    return -1;
  }
  os.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)0x200000001;
  os.super_basic_ostream<char,_std::char_traits<char>_>._8_4_ = TYPE_FLOAT_VEC3;
  os.super_basic_ostream<char,_std::char_traits<char>_>._12_4_ = TYPE_FLOAT_VEC4;
  textures_3[0] = TYPE_FLOAT;
  textures_3[1] = TYPE_FLOAT_VEC2;
  bVar4 = gl4cts::(anonymous_namespace)::BasicAllTargetsStore::Write<tcu::Vector<unsigned_int,4>>
                    ((BasicAllTargetsStore *)this,(GLenum)&os,(Vector<unsigned_int,_4> *)textures_3,
                     (Vector<unsigned_int,_4> *)expected_value);
  if (!bVar4) {
    return -1;
  }
  local_3a8._M_dataplus._M_p = (pointer)0x40000000bf800000;
  local_3a8._M_string_length = 0xc080000040400000;
  local_1d8[0].m_data[0] = -1.0;
  local_1d8[0].m_data[1] = 2.0;
  local_1d8[0].m_data[2] = 3.0;
  local_1d8[0].m_data[3] = -4.0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&os);
  poVar7 = std::operator<<((ostream *)&os,"#version 420 core\nlayout(");
  gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
            ((string *)textures_3,(void *)0x8814,e);
  poVar7 = std::operator<<(poVar7,(string *)textures_3);
  pcVar11 = ") writeonly uniform ";
  poVar7 = std::operator<<(poVar7,") writeonly uniform ");
  gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
            ((string *)&data,pcVar11);
  poVar7 = std::operator<<(poVar7,(string *)&data);
  pcVar11 = 
  "imageCubeArray g_image_cube_array;\nvoid main() {\n  ivec2 coord = ivec2(gl_FragCoord.xy);\n  imageStore(g_image_cube_array, ivec3(coord, 0), "
  ;
  poVar7 = std::operator<<(poVar7,
                           "imageCubeArray g_image_cube_array;\nvoid main() {\n  ivec2 coord = ivec2(gl_FragCoord.xy);\n  imageStore(g_image_cube_array, ivec3(coord, 0), "
                          );
  gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
            (&local_338,pcVar11);
  poVar7 = std::operator<<(poVar7,(string *)&local_338);
  poVar7 = std::operator<<(poVar7,"vec4");
  poVar7 = tcu::operator<<(poVar7,(Vector<float,_4> *)&local_3a8);
  pcVar11 = ");\n  imageStore(g_image_cube_array, ivec3(coord, 1), ";
  poVar7 = std::operator<<(poVar7,");\n  imageStore(g_image_cube_array, ivec3(coord, 1), ");
  gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
            (&local_358,pcVar11);
  poVar7 = std::operator<<(poVar7,(string *)&local_358);
  poVar7 = std::operator<<(poVar7,"vec4");
  poVar7 = tcu::operator<<(poVar7,(Vector<float,_4> *)&local_3a8);
  pcVar11 = ");\n  imageStore(g_image_cube_array, ivec3(coord, 2), ";
  poVar7 = std::operator<<(poVar7,");\n  imageStore(g_image_cube_array, ivec3(coord, 2), ");
  gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
            ((string *)textures,pcVar11);
  poVar7 = std::operator<<(poVar7,(string *)textures);
  poVar7 = std::operator<<(poVar7,"vec4");
  poVar7 = tcu::operator<<(poVar7,(Vector<float,_4> *)&local_3a8);
  pcVar11 = ");\n  imageStore(g_image_cube_array, ivec3(coord, 3), ";
  poVar7 = std::operator<<(poVar7,");\n  imageStore(g_image_cube_array, ivec3(coord, 3), ");
  gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
            (&local_1f8,pcVar11);
  poVar7 = std::operator<<(poVar7,(string *)&local_1f8);
  poVar7 = std::operator<<(poVar7,"vec4");
  poVar7 = tcu::operator<<(poVar7,(Vector<float,_4> *)&local_3a8);
  pcVar11 = ");\n  imageStore(g_image_cube_array, ivec3(coord, 4), ";
  poVar7 = std::operator<<(poVar7,");\n  imageStore(g_image_cube_array, ivec3(coord, 4), ");
  gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
            (&local_218,pcVar11);
  poVar7 = std::operator<<(poVar7,(string *)&local_218);
  poVar7 = std::operator<<(poVar7,"vec4");
  poVar7 = tcu::operator<<(poVar7,(Vector<float,_4> *)&local_3a8);
  pcVar11 = ");\n  imageStore(g_image_cube_array, ivec3(coord, 5), ";
  poVar7 = std::operator<<(poVar7,");\n  imageStore(g_image_cube_array, ivec3(coord, 5), ");
  gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
            (&local_238,pcVar11);
  poVar7 = std::operator<<(poVar7,(string *)&local_238);
  poVar7 = std::operator<<(poVar7,"vec4");
  poVar7 = tcu::operator<<(poVar7,(Vector<float,_4> *)&local_3a8);
  pcVar11 = ");\n  imageStore(g_image_cube_array, ivec3(coord, 6), ";
  poVar7 = std::operator<<(poVar7,");\n  imageStore(g_image_cube_array, ivec3(coord, 6), ");
  gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
            (&local_258,pcVar11);
  poVar7 = std::operator<<(poVar7,(string *)&local_258);
  poVar7 = std::operator<<(poVar7,"vec4");
  poVar7 = tcu::operator<<(poVar7,(Vector<float,_4> *)&local_3a8);
  pcVar11 = ");\n  imageStore(g_image_cube_array, ivec3(coord, 7), ";
  poVar7 = std::operator<<(poVar7,");\n  imageStore(g_image_cube_array, ivec3(coord, 7), ");
  gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
            (&local_278,pcVar11);
  poVar7 = std::operator<<(poVar7,(string *)&local_278);
  poVar7 = std::operator<<(poVar7,"vec4");
  poVar7 = tcu::operator<<(poVar7,(Vector<float,_4> *)&local_3a8);
  pcVar11 = ");\n  imageStore(g_image_cube_array, ivec3(coord, 8), ";
  poVar7 = std::operator<<(poVar7,");\n  imageStore(g_image_cube_array, ivec3(coord, 8), ");
  gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
            (&local_298,pcVar11);
  poVar7 = std::operator<<(poVar7,(string *)&local_298);
  poVar7 = std::operator<<(poVar7,"vec4");
  poVar7 = tcu::operator<<(poVar7,(Vector<float,_4> *)&local_3a8);
  pcVar11 = ");\n  imageStore(g_image_cube_array, ivec3(coord, 9), ";
  poVar7 = std::operator<<(poVar7,");\n  imageStore(g_image_cube_array, ivec3(coord, 9), ");
  gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
            (&local_2b8,pcVar11);
  poVar7 = std::operator<<(poVar7,(string *)&local_2b8);
  poVar7 = std::operator<<(poVar7,"vec4");
  poVar7 = tcu::operator<<(poVar7,(Vector<float,_4> *)&local_3a8);
  pcVar11 = ");\n  imageStore(g_image_cube_array, ivec3(coord, 10), ";
  poVar7 = std::operator<<(poVar7,");\n  imageStore(g_image_cube_array, ivec3(coord, 10), ");
  gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
            (&local_2d8,pcVar11);
  poVar7 = std::operator<<(poVar7,(string *)&local_2d8);
  poVar7 = std::operator<<(poVar7,"vec4");
  poVar7 = tcu::operator<<(poVar7,(Vector<float,_4> *)&local_3a8);
  pcVar11 = ");\n  imageStore(g_image_cube_array, ivec3(coord, 11), ";
  poVar7 = std::operator<<(poVar7,");\n  imageStore(g_image_cube_array, ivec3(coord, 11), ");
  gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
            (&local_2f8,pcVar11);
  poVar7 = std::operator<<(poVar7,(string *)&local_2f8);
  poVar7 = std::operator<<(poVar7,"vec4");
  poVar7 = tcu::operator<<(poVar7,(Vector<float,_4> *)&local_3a8);
  std::operator<<(poVar7,");\n  discard;\n}");
  std::__cxx11::string::~string((string *)&local_2f8);
  std::__cxx11::string::~string((string *)&local_2d8);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::__cxx11::string::~string((string *)&local_298);
  std::__cxx11::string::~string((string *)&local_278);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)textures);
  std::__cxx11::string::~string((string *)&local_358);
  std::__cxx11::string::~string((string *)&local_338);
  std::__cxx11::string::~string((string *)&data);
  std::__cxx11::string::~string((string *)textures_3);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&os);
  GVar5 = ShaderImageLoadStoreBase::BuildProgram
                    (&this->super_ShaderImageLoadStoreBase,
                     "#version 420 core\nlayout(location = 0) in vec4 i_position;\nvoid main() {\n  gl_Position = i_position;\n}"
                     ,(char *)0x0,(char *)0x0,(char *)0x0,local_318._M_dataplus._M_p,(bool *)0x0);
  std::__cxx11::string::~string((string *)&local_318);
  this_00 = &(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  glu::CallLogWrapper::glGenTextures(this_00,1,textures);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            (&data,0xc00,(allocator_type *)&os);
  glu::CallLogWrapper::glBindTexture(this_00,0x9009,textures[0]);
  glu::CallLogWrapper::glTexParameteri(this_00,0x9009,0x2801,0x2601);
  glu::CallLogWrapper::glTexImage3D
            (this_00,0x9009,0,0x8814,0x10,0x10,0xc,0,0x1908,0x1406,
             data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  glu::CallLogWrapper::glBindTexture(this_00,0x9009,0);
  glu::CallLogWrapper::glBindImageTexture(this_00,0,textures[0],0,'\x01',0,0x88b9,0x8814);
  glu::CallLogWrapper::glUseProgram(this_00,GVar5);
  glu::CallLogWrapper::glBindVertexArray(this_00,*vao);
  glu::CallLogWrapper::glViewport(this_00,0,0,0x10,0x10);
  glu::CallLogWrapper::glDrawArrays(this_00,5,0,4);
  pVVar2 = data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pVVar10 = data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start;
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&os,0.0);
  for (; pVVar10 != pVVar2; pVVar10 = pVVar10 + 1) {
    *(_func_int ***)pVVar10->m_data =
         os.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream;
    pVVar10->m_data[2] = (float)os.super_basic_ostream<char,_std::char_traits<char>_>._8_4_;
    pVVar10->m_data[3] = (float)os.super_basic_ostream<char,_std::char_traits<char>_>._12_4_;
  }
  glu::CallLogWrapper::glBindTexture(this_00,0x9009,textures[0]);
  glu::CallLogWrapper::glMemoryBarrier(this_00,0x100);
  glu::CallLogWrapper::glGetTexImage
            (this_00,0x9009,0,0x1908,0x1406,
             data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  glu::CallLogWrapper::glBindTexture(this_00,0x9009,0);
  lVar9 = 0x10;
  lVar12 = 0;
  do {
    lVar1 = lVar12 + 0x10;
    if (lVar1 == 0xc010) goto LAB_00a357b7;
    lVar9 = lVar9 + -0x10;
    bVar4 = tcu::allEqual<float,4>
                      ((Vector<float,_4> *)
                       ((long)(data.
                               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar12),
                       local_1d8);
    lVar12 = lVar1;
  } while (bVar4);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)&local_338,
             (Vector<float,_4> *)
             ((long)data.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start - lVar9));
  gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::ToString<tcu::Vector<float,4>>
            ((string *)&os,&local_338,v);
  pp_Var3 = os.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream;
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&local_358,local_1d8);
  gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::ToString<tcu::Vector<float,4>>
            ((string *)textures_3,&local_358,v_00);
  anon_unknown_0::Output
            ("GL_TEXTURE_CUBE_MAP_ARRAY target failed. Value is: %s. Value should be: %s.\n",pp_Var3
             ,textures_3);
  std::__cxx11::string::~string((string *)textures_3);
  std::__cxx11::string::~string((string *)&os);
LAB_00a357b7:
  glu::CallLogWrapper::glDeleteTextures(this_00,1,textures);
  glu::CallLogWrapper::glUseProgram(this_00,0);
  glu::CallLogWrapper::glDeleteProgram(this_00,GVar5);
  std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
            (&data.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>);
  if (lVar1 == 0xc010) {
    local_3a8._M_dataplus._M_p = (pointer)0xfffffffe00000001;
    local_3a8._M_string_length = 0xfffffffc00000003;
    local_1d8[0].m_data[0] = 1.4013e-45;
    local_1d8[0].m_data[1] = -NAN;
    local_1d8[0].m_data[2] = 4.2039e-45;
    local_1d8[0].m_data[3] = -NAN;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&os);
    poVar7 = std::operator<<((ostream *)&os,"#version 420 core\nlayout(");
    gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
              ((string *)textures_3,(void *)0x8d82,e_00);
    poVar7 = std::operator<<(poVar7,(string *)textures_3);
    pcVar11 = ") writeonly uniform ";
    poVar7 = std::operator<<(poVar7,") writeonly uniform ");
    gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>
              ((string *)&data,pcVar11);
    poVar7 = std::operator<<(poVar7,(string *)&data);
    pcVar11 = 
    "imageCubeArray g_image_cube_array;\nvoid main() {\n  ivec2 coord = ivec2(gl_FragCoord.xy);\n  imageStore(g_image_cube_array, ivec3(coord, 0), "
    ;
    poVar7 = std::operator<<(poVar7,
                             "imageCubeArray g_image_cube_array;\nvoid main() {\n  ivec2 coord = ivec2(gl_FragCoord.xy);\n  imageStore(g_image_cube_array, ivec3(coord, 0), "
                            );
    gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>
              (&local_338,pcVar11);
    poVar7 = std::operator<<(poVar7,(string *)&local_338);
    poVar7 = std::operator<<(poVar7,"vec4");
    poVar7 = tcu::operator<<(poVar7,(Vector<int,_4> *)&local_3a8);
    pcVar11 = ");\n  imageStore(g_image_cube_array, ivec3(coord, 1), ";
    poVar7 = std::operator<<(poVar7,");\n  imageStore(g_image_cube_array, ivec3(coord, 1), ");
    gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>
              (&local_358,pcVar11);
    poVar7 = std::operator<<(poVar7,(string *)&local_358);
    poVar7 = std::operator<<(poVar7,"vec4");
    poVar7 = tcu::operator<<(poVar7,(Vector<int,_4> *)&local_3a8);
    pcVar11 = ");\n  imageStore(g_image_cube_array, ivec3(coord, 2), ";
    poVar7 = std::operator<<(poVar7,");\n  imageStore(g_image_cube_array, ivec3(coord, 2), ");
    gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>
              ((string *)textures,pcVar11);
    poVar7 = std::operator<<(poVar7,(string *)textures);
    poVar7 = std::operator<<(poVar7,"vec4");
    poVar7 = tcu::operator<<(poVar7,(Vector<int,_4> *)&local_3a8);
    pcVar11 = ");\n  imageStore(g_image_cube_array, ivec3(coord, 3), ";
    poVar7 = std::operator<<(poVar7,");\n  imageStore(g_image_cube_array, ivec3(coord, 3), ");
    gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>
              (&local_1f8,pcVar11);
    poVar7 = std::operator<<(poVar7,(string *)&local_1f8);
    poVar7 = std::operator<<(poVar7,"vec4");
    poVar7 = tcu::operator<<(poVar7,(Vector<int,_4> *)&local_3a8);
    pcVar11 = ");\n  imageStore(g_image_cube_array, ivec3(coord, 4), ";
    poVar7 = std::operator<<(poVar7,");\n  imageStore(g_image_cube_array, ivec3(coord, 4), ");
    gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>
              (&local_218,pcVar11);
    poVar7 = std::operator<<(poVar7,(string *)&local_218);
    poVar7 = std::operator<<(poVar7,"vec4");
    poVar7 = tcu::operator<<(poVar7,(Vector<int,_4> *)&local_3a8);
    pcVar11 = ");\n  imageStore(g_image_cube_array, ivec3(coord, 5), ";
    poVar7 = std::operator<<(poVar7,");\n  imageStore(g_image_cube_array, ivec3(coord, 5), ");
    gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>
              (&local_238,pcVar11);
    poVar7 = std::operator<<(poVar7,(string *)&local_238);
    poVar7 = std::operator<<(poVar7,"vec4");
    poVar7 = tcu::operator<<(poVar7,(Vector<int,_4> *)&local_3a8);
    pcVar11 = ");\n  imageStore(g_image_cube_array, ivec3(coord, 6), ";
    poVar7 = std::operator<<(poVar7,");\n  imageStore(g_image_cube_array, ivec3(coord, 6), ");
    gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>
              (&local_258,pcVar11);
    poVar7 = std::operator<<(poVar7,(string *)&local_258);
    poVar7 = std::operator<<(poVar7,"vec4");
    poVar7 = tcu::operator<<(poVar7,(Vector<int,_4> *)&local_3a8);
    pcVar11 = ");\n  imageStore(g_image_cube_array, ivec3(coord, 7), ";
    poVar7 = std::operator<<(poVar7,");\n  imageStore(g_image_cube_array, ivec3(coord, 7), ");
    gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>
              (&local_278,pcVar11);
    poVar7 = std::operator<<(poVar7,(string *)&local_278);
    poVar7 = std::operator<<(poVar7,"vec4");
    poVar7 = tcu::operator<<(poVar7,(Vector<int,_4> *)&local_3a8);
    pcVar11 = ");\n  imageStore(g_image_cube_array, ivec3(coord, 8), ";
    poVar7 = std::operator<<(poVar7,");\n  imageStore(g_image_cube_array, ivec3(coord, 8), ");
    gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>
              (&local_298,pcVar11);
    poVar7 = std::operator<<(poVar7,(string *)&local_298);
    poVar7 = std::operator<<(poVar7,"vec4");
    poVar7 = tcu::operator<<(poVar7,(Vector<int,_4> *)&local_3a8);
    pcVar11 = ");\n  imageStore(g_image_cube_array, ivec3(coord, 9), ";
    poVar7 = std::operator<<(poVar7,");\n  imageStore(g_image_cube_array, ivec3(coord, 9), ");
    gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>
              (&local_2b8,pcVar11);
    poVar7 = std::operator<<(poVar7,(string *)&local_2b8);
    poVar7 = std::operator<<(poVar7,"vec4");
    poVar7 = tcu::operator<<(poVar7,(Vector<int,_4> *)&local_3a8);
    pcVar11 = ");\n  imageStore(g_image_cube_array, ivec3(coord, 10), ";
    poVar7 = std::operator<<(poVar7,");\n  imageStore(g_image_cube_array, ivec3(coord, 10), ");
    gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>
              (&local_2d8,pcVar11);
    poVar7 = std::operator<<(poVar7,(string *)&local_2d8);
    poVar7 = std::operator<<(poVar7,"vec4");
    poVar7 = tcu::operator<<(poVar7,(Vector<int,_4> *)&local_3a8);
    pcVar11 = ");\n  imageStore(g_image_cube_array, ivec3(coord, 11), ";
    poVar7 = std::operator<<(poVar7,");\n  imageStore(g_image_cube_array, ivec3(coord, 11), ");
    gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>
              (&local_2f8,pcVar11);
    poVar7 = std::operator<<(poVar7,(string *)&local_2f8);
    poVar7 = std::operator<<(poVar7,"vec4");
    poVar7 = tcu::operator<<(poVar7,(Vector<int,_4> *)&local_3a8);
    std::operator<<(poVar7,");\n  discard;\n}");
    std::__cxx11::string::~string((string *)&local_2f8);
    std::__cxx11::string::~string((string *)&local_2d8);
    std::__cxx11::string::~string((string *)&local_2b8);
    std::__cxx11::string::~string((string *)&local_298);
    std::__cxx11::string::~string((string *)&local_278);
    std::__cxx11::string::~string((string *)&local_258);
    std::__cxx11::string::~string((string *)&local_238);
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::~string((string *)textures);
    std::__cxx11::string::~string((string *)&local_358);
    std::__cxx11::string::~string((string *)&local_338);
    std::__cxx11::string::~string((string *)&data);
    std::__cxx11::string::~string((string *)textures_3);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&os);
    GVar5 = ShaderImageLoadStoreBase::BuildProgram
                      (&this->super_ShaderImageLoadStoreBase,
                       "#version 420 core\nlayout(location = 0) in vec4 i_position;\nvoid main() {\n  gl_Position = i_position;\n}"
                       ,(char *)0x0,(char *)0x0,(char *)0x0,local_318._M_dataplus._M_p,(bool *)0x0);
    std::__cxx11::string::~string((string *)&local_318);
    glu::CallLogWrapper::glGenTextures(this_00,1,textures);
    std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::vector
              ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)&data,0xc00,
               (allocator_type *)&os);
    glu::CallLogWrapper::glBindTexture(this_00,0x9009,textures[0]);
    glu::CallLogWrapper::glTexParameteri(this_00,0x9009,0x2801,0x2601);
    glu::CallLogWrapper::glTexImage3D
              (this_00,0x9009,0,0x8d82,0x10,0x10,0xc,0,0x8d99,0x1404,
               data.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start);
    glu::CallLogWrapper::glBindTexture(this_00,0x9009,0);
    glu::CallLogWrapper::glBindImageTexture(this_00,0,textures[0],0,'\x01',0,0x88b9,0x8d82);
    glu::CallLogWrapper::glUseProgram(this_00,GVar5);
    glu::CallLogWrapper::glBindVertexArray(this_00,*vao);
    glu::CallLogWrapper::glViewport(this_00,0,0,0x10,0x10);
    glu::CallLogWrapper::glDrawArrays(this_00,5,0,4);
    pVVar2 = data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pVVar10 = data.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
    tcu::Vector<int,_4>::Vector((Vector<int,_4> *)&os,0);
    for (; pVVar10 != pVVar2; pVVar10 = pVVar10 + 1) {
      *(_func_int ***)pVVar10->m_data =
           os.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream;
      pVVar10->m_data[2] = (float)os.super_basic_ostream<char,_std::char_traits<char>_>._8_4_;
      pVVar10->m_data[3] = (float)os.super_basic_ostream<char,_std::char_traits<char>_>._12_4_;
    }
    glu::CallLogWrapper::glBindTexture(this_00,0x9009,textures[0]);
    glu::CallLogWrapper::glMemoryBarrier(this_00,0x100);
    glu::CallLogWrapper::glGetTexImage
              (this_00,0x9009,0,0x8d99,0x1404,
               data.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start);
    glu::CallLogWrapper::glBindTexture(this_00,0x9009,0);
    lVar9 = 0x10;
    lVar12 = 0;
    do {
      lVar1 = lVar12 + 0x10;
      if (lVar1 == 0xc010) goto LAB_00a35f79;
      lVar9 = lVar9 + -0x10;
      bVar4 = tcu::allEqual<int,4>
                        ((Vector<int,_4> *)
                         ((long)(data.
                                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar12),
                         (Vector<int,_4> *)local_1d8);
      lVar12 = lVar1;
    } while (bVar4);
    tcu::Vector<int,_4>::Vector
              ((Vector<int,_4> *)&local_338,
               (Vector<int,_4> *)
               ((long)data.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start - lVar9));
    gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::ToString<tcu::Vector<int,4>>
              ((string *)&os,&local_338,v_01);
    pp_Var3 = os.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream;
    tcu::Vector<int,_4>::Vector((Vector<int,_4> *)&local_358,(Vector<int,_4> *)local_1d8);
    gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::ToString<tcu::Vector<int,4>>
              ((string *)textures_3,&local_358,v_02);
    anon_unknown_0::Output
              ("GL_TEXTURE_CUBE_MAP_ARRAY target failed. Value is: %s. Value should be: %s.\n",
               pp_Var3,textures_3);
    std::__cxx11::string::~string((string *)textures_3);
    std::__cxx11::string::~string((string *)&os);
LAB_00a35f79:
    glu::CallLogWrapper::glDeleteTextures(this_00,1,textures);
    glu::CallLogWrapper::glUseProgram(this_00,0);
    glu::CallLogWrapper::glDeleteProgram(this_00,GVar5);
    std::_Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::~_Vector_base
              ((_Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)&data);
    if (lVar1 == 0xc010) {
      local_3a8._M_dataplus._M_p = (pointer)0x200000001;
      local_3a8._M_string_length._0_4_ = TYPE_FLOAT_VEC3;
      local_3a8._M_string_length._4_4_ = TYPE_FLOAT_VEC4;
      local_1d8[0].m_data[0] = 1.4013e-45;
      local_1d8[0].m_data[1] = 2.8026e-45;
      local_1d8[0].m_data[2] = 4.2039e-45;
      local_1d8[0].m_data[3] = 5.60519e-45;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&os);
      poVar7 = std::operator<<((ostream *)&os,"#version 420 core\nlayout(");
      gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
                ((string *)textures_3,(void *)0x8d70,e_01);
      poVar7 = std::operator<<(poVar7,(string *)textures_3);
      pcVar11 = ") writeonly uniform ";
      poVar7 = std::operator<<(poVar7,") writeonly uniform ");
      gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::
      TypePrefix<tcu::Vector<unsigned_int,4>>((string *)&data,pcVar11);
      poVar7 = std::operator<<(poVar7,(string *)&data);
      pcVar11 = 
      "imageCubeArray g_image_cube_array;\nvoid main() {\n  ivec2 coord = ivec2(gl_FragCoord.xy);\n  imageStore(g_image_cube_array, ivec3(coord, 0), "
      ;
      poVar7 = std::operator<<(poVar7,
                               "imageCubeArray g_image_cube_array;\nvoid main() {\n  ivec2 coord = ivec2(gl_FragCoord.xy);\n  imageStore(g_image_cube_array, ivec3(coord, 0), "
                              );
      gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::
      TypePrefix<tcu::Vector<unsigned_int,4>>(&local_338,pcVar11);
      poVar7 = std::operator<<(poVar7,(string *)&local_338);
      poVar7 = std::operator<<(poVar7,"vec4");
      poVar7 = tcu::operator<<(poVar7,(Vector<unsigned_int,_4> *)&local_3a8);
      pcVar11 = ");\n  imageStore(g_image_cube_array, ivec3(coord, 1), ";
      poVar7 = std::operator<<(poVar7,");\n  imageStore(g_image_cube_array, ivec3(coord, 1), ");
      gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::
      TypePrefix<tcu::Vector<unsigned_int,4>>(&local_358,pcVar11);
      poVar7 = std::operator<<(poVar7,(string *)&local_358);
      poVar7 = std::operator<<(poVar7,"vec4");
      poVar7 = tcu::operator<<(poVar7,(Vector<unsigned_int,_4> *)&local_3a8);
      pcVar11 = ");\n  imageStore(g_image_cube_array, ivec3(coord, 2), ";
      poVar7 = std::operator<<(poVar7,");\n  imageStore(g_image_cube_array, ivec3(coord, 2), ");
      gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::
      TypePrefix<tcu::Vector<unsigned_int,4>>((string *)textures,pcVar11);
      poVar7 = std::operator<<(poVar7,(string *)textures);
      poVar7 = std::operator<<(poVar7,"vec4");
      poVar7 = tcu::operator<<(poVar7,(Vector<unsigned_int,_4> *)&local_3a8);
      pcVar11 = ");\n  imageStore(g_image_cube_array, ivec3(coord, 3), ";
      poVar7 = std::operator<<(poVar7,");\n  imageStore(g_image_cube_array, ivec3(coord, 3), ");
      gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::
      TypePrefix<tcu::Vector<unsigned_int,4>>(&local_1f8,pcVar11);
      poVar7 = std::operator<<(poVar7,(string *)&local_1f8);
      poVar7 = std::operator<<(poVar7,"vec4");
      poVar7 = tcu::operator<<(poVar7,(Vector<unsigned_int,_4> *)&local_3a8);
      pcVar11 = ");\n  imageStore(g_image_cube_array, ivec3(coord, 4), ";
      poVar7 = std::operator<<(poVar7,");\n  imageStore(g_image_cube_array, ivec3(coord, 4), ");
      gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::
      TypePrefix<tcu::Vector<unsigned_int,4>>(&local_218,pcVar11);
      poVar7 = std::operator<<(poVar7,(string *)&local_218);
      poVar7 = std::operator<<(poVar7,"vec4");
      poVar7 = tcu::operator<<(poVar7,(Vector<unsigned_int,_4> *)&local_3a8);
      pcVar11 = ");\n  imageStore(g_image_cube_array, ivec3(coord, 5), ";
      poVar7 = std::operator<<(poVar7,");\n  imageStore(g_image_cube_array, ivec3(coord, 5), ");
      gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::
      TypePrefix<tcu::Vector<unsigned_int,4>>(&local_238,pcVar11);
      poVar7 = std::operator<<(poVar7,(string *)&local_238);
      poVar7 = std::operator<<(poVar7,"vec4");
      poVar7 = tcu::operator<<(poVar7,(Vector<unsigned_int,_4> *)&local_3a8);
      pcVar11 = ");\n  imageStore(g_image_cube_array, ivec3(coord, 6), ";
      poVar7 = std::operator<<(poVar7,");\n  imageStore(g_image_cube_array, ivec3(coord, 6), ");
      gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::
      TypePrefix<tcu::Vector<unsigned_int,4>>(&local_258,pcVar11);
      poVar7 = std::operator<<(poVar7,(string *)&local_258);
      poVar7 = std::operator<<(poVar7,"vec4");
      poVar7 = tcu::operator<<(poVar7,(Vector<unsigned_int,_4> *)&local_3a8);
      pcVar11 = ");\n  imageStore(g_image_cube_array, ivec3(coord, 7), ";
      poVar7 = std::operator<<(poVar7,");\n  imageStore(g_image_cube_array, ivec3(coord, 7), ");
      gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::
      TypePrefix<tcu::Vector<unsigned_int,4>>(&local_278,pcVar11);
      poVar7 = std::operator<<(poVar7,(string *)&local_278);
      poVar7 = std::operator<<(poVar7,"vec4");
      poVar7 = tcu::operator<<(poVar7,(Vector<unsigned_int,_4> *)&local_3a8);
      pcVar11 = ");\n  imageStore(g_image_cube_array, ivec3(coord, 8), ";
      poVar7 = std::operator<<(poVar7,");\n  imageStore(g_image_cube_array, ivec3(coord, 8), ");
      gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::
      TypePrefix<tcu::Vector<unsigned_int,4>>(&local_298,pcVar11);
      poVar7 = std::operator<<(poVar7,(string *)&local_298);
      poVar7 = std::operator<<(poVar7,"vec4");
      poVar7 = tcu::operator<<(poVar7,(Vector<unsigned_int,_4> *)&local_3a8);
      pcVar11 = ");\n  imageStore(g_image_cube_array, ivec3(coord, 9), ";
      poVar7 = std::operator<<(poVar7,");\n  imageStore(g_image_cube_array, ivec3(coord, 9), ");
      gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::
      TypePrefix<tcu::Vector<unsigned_int,4>>(&local_2b8,pcVar11);
      poVar7 = std::operator<<(poVar7,(string *)&local_2b8);
      poVar7 = std::operator<<(poVar7,"vec4");
      poVar7 = tcu::operator<<(poVar7,(Vector<unsigned_int,_4> *)&local_3a8);
      pcVar11 = ");\n  imageStore(g_image_cube_array, ivec3(coord, 10), ";
      poVar7 = std::operator<<(poVar7,");\n  imageStore(g_image_cube_array, ivec3(coord, 10), ");
      gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::
      TypePrefix<tcu::Vector<unsigned_int,4>>(&local_2d8,pcVar11);
      poVar7 = std::operator<<(poVar7,(string *)&local_2d8);
      poVar7 = std::operator<<(poVar7,"vec4");
      poVar7 = tcu::operator<<(poVar7,(Vector<unsigned_int,_4> *)&local_3a8);
      pcVar11 = ");\n  imageStore(g_image_cube_array, ivec3(coord, 11), ";
      poVar7 = std::operator<<(poVar7,");\n  imageStore(g_image_cube_array, ivec3(coord, 11), ");
      gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::
      TypePrefix<tcu::Vector<unsigned_int,4>>(&local_2f8,pcVar11);
      poVar7 = std::operator<<(poVar7,(string *)&local_2f8);
      poVar7 = std::operator<<(poVar7,"vec4");
      poVar7 = tcu::operator<<(poVar7,(Vector<unsigned_int,_4> *)&local_3a8);
      std::operator<<(poVar7,");\n  discard;\n}");
      std::__cxx11::string::~string((string *)&local_2f8);
      std::__cxx11::string::~string((string *)&local_2d8);
      std::__cxx11::string::~string((string *)&local_2b8);
      std::__cxx11::string::~string((string *)&local_298);
      std::__cxx11::string::~string((string *)&local_278);
      std::__cxx11::string::~string((string *)&local_258);
      std::__cxx11::string::~string((string *)&local_238);
      std::__cxx11::string::~string((string *)&local_218);
      std::__cxx11::string::~string((string *)&local_1f8);
      std::__cxx11::string::~string((string *)textures);
      std::__cxx11::string::~string((string *)&local_358);
      std::__cxx11::string::~string((string *)&local_338);
      std::__cxx11::string::~string((string *)&data);
      std::__cxx11::string::~string((string *)textures_3);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&os);
      GVar5 = ShaderImageLoadStoreBase::BuildProgram
                        (&this->super_ShaderImageLoadStoreBase,
                         "#version 420 core\nlayout(location = 0) in vec4 i_position;\nvoid main() {\n  gl_Position = i_position;\n}"
                         ,(char *)0x0,(char *)0x0,(char *)0x0,local_318._M_dataplus._M_p,(bool *)0x0
                        );
      std::__cxx11::string::~string((string *)&local_318);
      glu::CallLogWrapper::glGenTextures(this_00,1,textures);
      std::vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>::
      vector((vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_> *
             )&data,0xc00,(allocator_type *)&os);
      glu::CallLogWrapper::glBindTexture(this_00,0x9009,textures[0]);
      glu::CallLogWrapper::glTexParameteri(this_00,0x9009,0x2801,0x2601);
      glu::CallLogWrapper::glTexImage3D
                (this_00,0x9009,0,0x8d70,0x10,0x10,0xc,0,0x8d99,0x1405,
                 data.
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_start);
      glu::CallLogWrapper::glBindTexture(this_00,0x9009,0);
      glu::CallLogWrapper::glBindImageTexture(this_00,0,textures[0],0,'\x01',0,0x88b9,0x8d70);
      glu::CallLogWrapper::glUseProgram(this_00,GVar5);
      glu::CallLogWrapper::glBindVertexArray(this_00,*vao);
      glu::CallLogWrapper::glViewport(this_00,0,0,0x10,0x10);
      glu::CallLogWrapper::glDrawArrays(this_00,5,0,4);
      pVVar10 = data.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_start;
      tcu::Vector<unsigned_int,_4>::Vector((Vector<unsigned_int,_4> *)&os,0);
      for (; pVVar10 !=
             data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
             ._M_impl.super__Vector_impl_data._M_finish; pVVar10 = pVVar10 + 1) {
        *(_func_int ***)pVVar10->m_data =
             os.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream;
        pVVar10->m_data[2] = (float)os.super_basic_ostream<char,_std::char_traits<char>_>._8_4_;
        pVVar10->m_data[3] = (float)os.super_basic_ostream<char,_std::char_traits<char>_>._12_4_;
      }
      glu::CallLogWrapper::glBindTexture(this_00,0x9009,textures[0]);
      glu::CallLogWrapper::glMemoryBarrier(this_00,0x100);
      glu::CallLogWrapper::glGetTexImage
                (this_00,0x9009,0,0x8d99,0x1405,
                 data.
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_start);
      glu::CallLogWrapper::glBindTexture(this_00,0x9009,0);
      lVar9 = 0x10;
      lVar12 = 0;
      do {
        lVar1 = lVar12 + 0x10;
        if (lVar1 == 0xc010) goto LAB_00a3673b;
        lVar9 = lVar9 + -0x10;
        bVar4 = tcu::allEqual<unsigned_int,4>
                          ((Vector<unsigned_int,_4> *)
                           ((long)(data.
                                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar12),
                           (Vector<unsigned_int,_4> *)local_1d8);
        lVar12 = lVar1;
      } while (bVar4);
      tcu::Vector<unsigned_int,_4>::Vector
                ((Vector<unsigned_int,_4> *)&local_338,
                 (Vector<unsigned_int,_4> *)
                 ((long)data.
                        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_start - lVar9));
      gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::ToString<tcu::Vector<unsigned_int,4>>
                ((string *)&os,&local_338,v_03);
      pp_Var3 = os.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream;
      tcu::Vector<unsigned_int,_4>::Vector
                ((Vector<unsigned_int,_4> *)&local_358,(Vector<unsigned_int,_4> *)local_1d8);
      gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::ToString<tcu::Vector<unsigned_int,4>>
                ((string *)textures_3,&local_358,v_04);
      anon_unknown_0::Output
                ("GL_TEXTURE_CUBE_MAP_ARRAY target failed. Value is: %s. Value should be: %s.\n",
                 pp_Var3,textures_3);
      std::__cxx11::string::~string((string *)textures_3);
      std::__cxx11::string::~string((string *)&os);
LAB_00a3673b:
      glu::CallLogWrapper::glDeleteTextures(this_00,1,textures);
      glu::CallLogWrapper::glUseProgram(this_00,0);
      glu::CallLogWrapper::glDeleteProgram(this_00,GVar5);
      std::
      _Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>::
      ~_Vector_base((_Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                     *)&data);
      if (lVar1 == 0xc010) {
        bVar4 = ShaderImageLoadStoreBase::SupportedSamples
                          (&this->super_ShaderImageLoadStoreBase,GVar5);
        if (!bVar4) {
          return 0;
        }
        local_3f8.m_data[0] = -1.0;
        local_3f8.m_data[1] = 2.0;
        local_3f8.m_data[2] = 3.0;
        local_3f8.m_data[3] = -4.0;
        local_408.m_data[0] = -1.0;
        local_408.m_data[1] = 2.0;
        local_408.m_data[2] = 3.0;
        local_408.m_data[3] = -4.0;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&os);
        poVar7 = std::operator<<((ostream *)&os,"#version 420 core\nlayout(");
        gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
                  ((string *)textures_3,(void *)0x8814,e_02);
        poVar7 = std::operator<<(poVar7,(string *)textures_3);
        pcVar11 = ") writeonly uniform ";
        poVar7 = std::operator<<(poVar7,") writeonly uniform ");
        gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
                  ((string *)&data,pcVar11);
        poVar7 = std::operator<<(poVar7,(string *)&data);
        poVar7 = std::operator<<(poVar7,"image2DMS g_image_2dms;\nlayout(");
        gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
                  (&local_338,(void *)0x8814,e_03);
        poVar7 = std::operator<<(poVar7,(string *)&local_338);
        pcVar11 = ") writeonly uniform ";
        poVar7 = std::operator<<(poVar7,") writeonly uniform ");
        gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
                  (&local_358,pcVar11);
        poVar7 = std::operator<<(poVar7,(string *)&local_358);
        pcVar11 = 
        "image2DMSArray g_image_2dms_array;\nvoid main() {\n  ivec2 coord = ivec2(gl_FragCoord.xy);\n  imageStore(g_image_2dms, coord, 0, "
        ;
        poVar7 = std::operator<<(poVar7,
                                 "image2DMSArray g_image_2dms_array;\nvoid main() {\n  ivec2 coord = ivec2(gl_FragCoord.xy);\n  imageStore(g_image_2dms, coord, 0, "
                                );
        gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
                  ((string *)textures,pcVar11);
        poVar7 = std::operator<<(poVar7,(string *)textures);
        poVar7 = std::operator<<(poVar7,"vec4");
        poVar7 = tcu::operator<<(poVar7,&local_3f8);
        pcVar11 = ");\n  imageStore(g_image_2dms, coord, 1, ";
        poVar7 = std::operator<<(poVar7,");\n  imageStore(g_image_2dms, coord, 1, ");
        gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
                  (&local_1f8,pcVar11);
        poVar7 = std::operator<<(poVar7,(string *)&local_1f8);
        poVar7 = std::operator<<(poVar7,"vec4");
        poVar7 = tcu::operator<<(poVar7,&local_3f8);
        pcVar11 = ");\n  imageStore(g_image_2dms, coord, 2, ";
        poVar7 = std::operator<<(poVar7,");\n  imageStore(g_image_2dms, coord, 2, ");
        gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
                  (&local_218,pcVar11);
        poVar7 = std::operator<<(poVar7,(string *)&local_218);
        poVar7 = std::operator<<(poVar7,"vec4");
        poVar7 = tcu::operator<<(poVar7,&local_3f8);
        pcVar11 = ");\n  imageStore(g_image_2dms, coord, 3, ";
        poVar7 = std::operator<<(poVar7,");\n  imageStore(g_image_2dms, coord, 3, ");
        gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
                  (&local_238,pcVar11);
        poVar7 = std::operator<<(poVar7,(string *)&local_238);
        poVar7 = std::operator<<(poVar7,"vec4");
        poVar7 = tcu::operator<<(poVar7,&local_3f8);
        pcVar11 = ");\n  imageStore(g_image_2dms_array, ivec3(coord, 0), 0, ";
        poVar7 = std::operator<<(poVar7,");\n  imageStore(g_image_2dms_array, ivec3(coord, 0), 0, ")
        ;
        gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
                  (&local_258,pcVar11);
        poVar7 = std::operator<<(poVar7,(string *)&local_258);
        poVar7 = std::operator<<(poVar7,"vec4");
        poVar7 = tcu::operator<<(poVar7,&local_3f8);
        pcVar11 = ");\n  imageStore(g_image_2dms_array, ivec3(coord, 0), 1, ";
        poVar7 = std::operator<<(poVar7,");\n  imageStore(g_image_2dms_array, ivec3(coord, 0), 1, ")
        ;
        gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
                  (&local_278,pcVar11);
        poVar7 = std::operator<<(poVar7,(string *)&local_278);
        poVar7 = std::operator<<(poVar7,"vec4");
        poVar7 = tcu::operator<<(poVar7,&local_3f8);
        pcVar11 = ");\n  imageStore(g_image_2dms_array, ivec3(coord, 0), 2, ";
        poVar7 = std::operator<<(poVar7,");\n  imageStore(g_image_2dms_array, ivec3(coord, 0), 2, ")
        ;
        gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
                  (&local_298,pcVar11);
        poVar7 = std::operator<<(poVar7,(string *)&local_298);
        poVar7 = std::operator<<(poVar7,"vec4");
        poVar7 = tcu::operator<<(poVar7,&local_3f8);
        pcVar11 = ");\n  imageStore(g_image_2dms_array, ivec3(coord, 0), 3, ";
        poVar7 = std::operator<<(poVar7,");\n  imageStore(g_image_2dms_array, ivec3(coord, 0), 3, ")
        ;
        gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
                  (&local_2b8,pcVar11);
        poVar7 = std::operator<<(poVar7,(string *)&local_2b8);
        poVar7 = std::operator<<(poVar7,"vec4");
        poVar7 = tcu::operator<<(poVar7,&local_3f8);
        pcVar11 = ");\n  imageStore(g_image_2dms_array, ivec3(coord, 1), 0, ";
        poVar7 = std::operator<<(poVar7,");\n  imageStore(g_image_2dms_array, ivec3(coord, 1), 0, ")
        ;
        gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
                  (&local_2d8,pcVar11);
        poVar7 = std::operator<<(poVar7,(string *)&local_2d8);
        poVar7 = std::operator<<(poVar7,"vec4");
        poVar7 = tcu::operator<<(poVar7,&local_3f8);
        pcVar11 = ");\n  imageStore(g_image_2dms_array, ivec3(coord, 1), 1, ";
        poVar7 = std::operator<<(poVar7,");\n  imageStore(g_image_2dms_array, ivec3(coord, 1), 1, ")
        ;
        gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
                  (&local_2f8,pcVar11);
        poVar7 = std::operator<<(poVar7,(string *)&local_2f8);
        poVar7 = std::operator<<(poVar7,"vec4");
        poVar7 = tcu::operator<<(poVar7,&local_3f8);
        pcVar11 = ");\n  imageStore(g_image_2dms_array, ivec3(coord, 1), 2, ";
        poVar7 = std::operator<<(poVar7,");\n  imageStore(g_image_2dms_array, ivec3(coord, 1), 2, ")
        ;
        gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
                  (&local_318,pcVar11);
        poVar7 = std::operator<<(poVar7,(string *)&local_318);
        poVar7 = std::operator<<(poVar7,"vec4");
        poVar7 = tcu::operator<<(poVar7,&local_3f8);
        pcVar11 = ");\n  imageStore(g_image_2dms_array, ivec3(coord, 1), 3, ";
        poVar7 = std::operator<<(poVar7,");\n  imageStore(g_image_2dms_array, ivec3(coord, 1), 3, ")
        ;
        gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
                  (&local_3a8,pcVar11);
        poVar7 = std::operator<<(poVar7,(string *)&local_3a8);
        poVar7 = std::operator<<(poVar7,"vec4");
        poVar7 = tcu::operator<<(poVar7,&local_3f8);
        std::operator<<(poVar7,");\n  discard;\n}");
        std::__cxx11::string::~string((string *)&local_3a8);
        std::__cxx11::string::~string((string *)&local_318);
        std::__cxx11::string::~string((string *)&local_2f8);
        std::__cxx11::string::~string((string *)&local_2d8);
        std::__cxx11::string::~string((string *)&local_2b8);
        std::__cxx11::string::~string((string *)&local_298);
        std::__cxx11::string::~string((string *)&local_278);
        std::__cxx11::string::~string((string *)&local_258);
        std::__cxx11::string::~string((string *)&local_238);
        std::__cxx11::string::~string((string *)&local_218);
        std::__cxx11::string::~string((string *)&local_1f8);
        std::__cxx11::string::~string((string *)textures);
        std::__cxx11::string::~string((string *)&local_358);
        std::__cxx11::string::~string((string *)&local_338);
        std::__cxx11::string::~string((string *)&data);
        std::__cxx11::string::~string((string *)textures_3);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&os);
        GVar5 = ShaderImageLoadStoreBase::BuildProgram
                          (&this->super_ShaderImageLoadStoreBase,
                           "#version 420 core\nlayout(location = 0) in vec4 i_position;\nvoid main() {\n  gl_Position = i_position;\n}"
                           ,(char *)0x0,(char *)0x0,(char *)0x0,(char *)local_1d8[0].m_data._0_8_,
                           (bool *)0x0);
        std::__cxx11::string::~string((string *)local_1d8);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&os);
        pcVar11 = "#version 420 core\nlayout(location = 0) out vec4 o_color;\nuniform ";
        poVar7 = std::operator<<((ostream *)&os,
                                 "#version 420 core\nlayout(location = 0) out vec4 o_color;\nuniform "
                                );
        gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
                  ((string *)textures_3,pcVar11);
        poVar7 = std::operator<<(poVar7,(string *)textures_3);
        pcVar11 = "sampler2DMS g_sampler_2dms;\nuniform ";
        poVar7 = std::operator<<(poVar7,"sampler2DMS g_sampler_2dms;\nuniform ");
        gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
                  ((string *)&data,pcVar11);
        poVar7 = std::operator<<(poVar7,(string *)&data);
        pcVar11 = 
        "sampler2DMSArray g_sampler_2dms_array;\nvoid main() {\n  o_color = vec4(0.0, 1.0, 0.0, 1.0);\n  ivec2 coord = ivec2(gl_FragCoord.xy);\n  if (texelFetch(g_sampler_2dms, coord, 0) != "
        ;
        poVar7 = std::operator<<(poVar7,
                                 "sampler2DMSArray g_sampler_2dms_array;\nvoid main() {\n  o_color = vec4(0.0, 1.0, 0.0, 1.0);\n  ivec2 coord = ivec2(gl_FragCoord.xy);\n  if (texelFetch(g_sampler_2dms, coord, 0) != "
                                );
        gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
                  (&local_338,pcVar11);
        poVar7 = std::operator<<(poVar7,(string *)&local_338);
        poVar7 = std::operator<<(poVar7,"vec4");
        poVar7 = tcu::operator<<(poVar7,&local_408);
        pcVar11 = 
        ") o_color = vec4(1.0, 0.0, 0.0, 0.1);\n  if (texelFetch(g_sampler_2dms, coord, 1) != ";
        poVar7 = std::operator<<(poVar7,
                                 ") o_color = vec4(1.0, 0.0, 0.0, 0.1);\n  if (texelFetch(g_sampler_2dms, coord, 1) != "
                                );
        gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
                  (&local_358,pcVar11);
        poVar7 = std::operator<<(poVar7,(string *)&local_358);
        poVar7 = std::operator<<(poVar7,"vec4");
        poVar7 = tcu::operator<<(poVar7,&local_408);
        pcVar11 = 
        ") o_color = vec4(1.0, 0.0, 0.0, 0.1);\n  if (texelFetch(g_sampler_2dms, coord, 2) != ";
        poVar7 = std::operator<<(poVar7,
                                 ") o_color = vec4(1.0, 0.0, 0.0, 0.1);\n  if (texelFetch(g_sampler_2dms, coord, 2) != "
                                );
        gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
                  ((string *)textures,pcVar11);
        poVar7 = std::operator<<(poVar7,(string *)textures);
        poVar7 = std::operator<<(poVar7,"vec4");
        poVar7 = tcu::operator<<(poVar7,&local_408);
        pcVar11 = 
        ") o_color = vec4(1.0, 0.0, 0.0, 0.1);\n  if (texelFetch(g_sampler_2dms, coord, 3) != ";
        poVar7 = std::operator<<(poVar7,
                                 ") o_color = vec4(1.0, 0.0, 0.0, 0.1);\n  if (texelFetch(g_sampler_2dms, coord, 3) != "
                                );
        gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
                  (&local_1f8,pcVar11);
        poVar7 = std::operator<<(poVar7,(string *)&local_1f8);
        poVar7 = std::operator<<(poVar7,"vec4");
        poVar7 = tcu::operator<<(poVar7,&local_408);
        pcVar11 = 
        ") o_color = vec4(1.0, 0.0, 0.0, 0.1);\n  if (texelFetch(g_sampler_2dms_array, ivec3(coord, 0), 0) != "
        ;
        poVar7 = std::operator<<(poVar7,
                                 ") o_color = vec4(1.0, 0.0, 0.0, 0.1);\n  if (texelFetch(g_sampler_2dms_array, ivec3(coord, 0), 0) != "
                                );
        gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
                  (&local_218,pcVar11);
        poVar7 = std::operator<<(poVar7,(string *)&local_218);
        poVar7 = std::operator<<(poVar7,"vec4");
        poVar7 = tcu::operator<<(poVar7,&local_408);
        pcVar11 = 
        ") o_color = vec4(1.0, 0.0, 0.0, 0.2);\n  if (texelFetch(g_sampler_2dms_array, ivec3(coord, 0), 1) != "
        ;
        poVar7 = std::operator<<(poVar7,
                                 ") o_color = vec4(1.0, 0.0, 0.0, 0.2);\n  if (texelFetch(g_sampler_2dms_array, ivec3(coord, 0), 1) != "
                                );
        gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
                  (&local_238,pcVar11);
        poVar7 = std::operator<<(poVar7,(string *)&local_238);
        poVar7 = std::operator<<(poVar7,"vec4");
        poVar7 = tcu::operator<<(poVar7,&local_408);
        pcVar11 = 
        ") o_color = vec4(1.0, 0.0, 0.0, 0.2);\n  if (texelFetch(g_sampler_2dms_array, ivec3(coord, 0), 2) != "
        ;
        poVar7 = std::operator<<(poVar7,
                                 ") o_color = vec4(1.0, 0.0, 0.0, 0.2);\n  if (texelFetch(g_sampler_2dms_array, ivec3(coord, 0), 2) != "
                                );
        gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
                  (&local_258,pcVar11);
        poVar7 = std::operator<<(poVar7,(string *)&local_258);
        poVar7 = std::operator<<(poVar7,"vec4");
        poVar7 = tcu::operator<<(poVar7,&local_408);
        pcVar11 = 
        ") o_color = vec4(1.0, 0.0, 0.0, 0.2);\n  if (texelFetch(g_sampler_2dms_array, ivec3(coord, 0), 3) != "
        ;
        poVar7 = std::operator<<(poVar7,
                                 ") o_color = vec4(1.0, 0.0, 0.0, 0.2);\n  if (texelFetch(g_sampler_2dms_array, ivec3(coord, 0), 3) != "
                                );
        gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
                  (&local_278,pcVar11);
        poVar7 = std::operator<<(poVar7,(string *)&local_278);
        poVar7 = std::operator<<(poVar7,"vec4");
        poVar7 = tcu::operator<<(poVar7,&local_408);
        pcVar11 = 
        ") o_color = vec4(1.0, 0.0, 0.0, 0.2);\n  if (texelFetch(g_sampler_2dms_array, ivec3(coord, 1), 0) != "
        ;
        poVar7 = std::operator<<(poVar7,
                                 ") o_color = vec4(1.0, 0.0, 0.0, 0.2);\n  if (texelFetch(g_sampler_2dms_array, ivec3(coord, 1), 0) != "
                                );
        gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
                  (&local_298,pcVar11);
        poVar7 = std::operator<<(poVar7,(string *)&local_298);
        poVar7 = std::operator<<(poVar7,"vec4");
        poVar7 = tcu::operator<<(poVar7,&local_408);
        pcVar11 = 
        ") o_color = vec4(1.0, 0.0, 0.0, 0.3);\n  if (texelFetch(g_sampler_2dms_array, ivec3(coord, 1), 1) != "
        ;
        poVar7 = std::operator<<(poVar7,
                                 ") o_color = vec4(1.0, 0.0, 0.0, 0.3);\n  if (texelFetch(g_sampler_2dms_array, ivec3(coord, 1), 1) != "
                                );
        gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
                  (&local_2b8,pcVar11);
        poVar7 = std::operator<<(poVar7,(string *)&local_2b8);
        poVar7 = std::operator<<(poVar7,"vec4");
        poVar7 = tcu::operator<<(poVar7,&local_408);
        pcVar11 = 
        ") o_color = vec4(1.0, 0.0, 0.0, 0.3);\n  if (texelFetch(g_sampler_2dms_array, ivec3(coord, 1), 2) != "
        ;
        poVar7 = std::operator<<(poVar7,
                                 ") o_color = vec4(1.0, 0.0, 0.0, 0.3);\n  if (texelFetch(g_sampler_2dms_array, ivec3(coord, 1), 2) != "
                                );
        gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
                  (&local_2d8,pcVar11);
        poVar7 = std::operator<<(poVar7,(string *)&local_2d8);
        poVar7 = std::operator<<(poVar7,"vec4");
        poVar7 = tcu::operator<<(poVar7,&local_408);
        pcVar11 = 
        ") o_color = vec4(1.0, 0.0, 0.0, 0.3);\n  if (texelFetch(g_sampler_2dms_array, ivec3(coord, 1), 3) != "
        ;
        poVar7 = std::operator<<(poVar7,
                                 ") o_color = vec4(1.0, 0.0, 0.0, 0.3);\n  if (texelFetch(g_sampler_2dms_array, ivec3(coord, 1), 3) != "
                                );
        gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
                  (&local_2f8,pcVar11);
        poVar7 = std::operator<<(poVar7,(string *)&local_2f8);
        poVar7 = std::operator<<(poVar7,"vec4");
        poVar7 = tcu::operator<<(poVar7,&local_408);
        std::operator<<(poVar7,") o_color = vec4(1.0, 0.0, 0.0, 0.3);\n}");
        std::__cxx11::string::~string((string *)&local_2f8);
        std::__cxx11::string::~string((string *)&local_2d8);
        std::__cxx11::string::~string((string *)&local_2b8);
        std::__cxx11::string::~string((string *)&local_298);
        std::__cxx11::string::~string((string *)&local_278);
        std::__cxx11::string::~string((string *)&local_258);
        std::__cxx11::string::~string((string *)&local_238);
        std::__cxx11::string::~string((string *)&local_218);
        std::__cxx11::string::~string((string *)&local_1f8);
        std::__cxx11::string::~string((string *)textures);
        std::__cxx11::string::~string((string *)&local_358);
        std::__cxx11::string::~string((string *)&local_338);
        std::__cxx11::string::~string((string *)&data);
        std::__cxx11::string::~string((string *)textures_3);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&os);
        program = ShaderImageLoadStoreBase::BuildProgram
                            (&this->super_ShaderImageLoadStoreBase,
                             "#version 420 core\nlayout(location = 0) in vec4 i_position;\nvoid main() {\n  gl_Position = i_position;\n}"
                             ,(char *)0x0,(char *)0x0,(char *)0x0,local_318._M_dataplus._M_p,
                             (bool *)0x0);
        std::__cxx11::string::~string((string *)&local_318);
        glu::CallLogWrapper::glGenTextures(this_00,2,textures_3);
        glu::CallLogWrapper::glBindTexture(this_00,0x9100,textures_3[0]);
        glu::CallLogWrapper::glTexImage2DMultisample(this_00,0x9100,4,0x8814,0x10,0x10,'\0');
        glu::CallLogWrapper::glBindTexture(this_00,0x9100,0);
        glu::CallLogWrapper::glBindTexture(this_00,0x9102,textures_3[1]);
        glu::CallLogWrapper::glTexImage3DMultisample(this_00,0x9102,4,0x8814,0x10,0x10,2,'\0');
        glu::CallLogWrapper::glBindTexture(this_00,0x9102,0);
        glu::CallLogWrapper::glBindImageTexture(this_00,1,textures_3[0],0,'\0',0,0x88b9,0x8814);
        pvVar13 = (vec4 *)0x0;
        glu::CallLogWrapper::glBindImageTexture(this_00,4,textures_3[1],0,'\x01',0,0x88b9,0x8814);
        glu::CallLogWrapper::glClear(this_00,0x4000);
        glu::CallLogWrapper::glUseProgram(this_00,GVar5);
        GVar6 = glu::CallLogWrapper::glGetUniformLocation(this_00,GVar5,"g_image_2dms");
        glu::CallLogWrapper::glUniform1i(this_00,GVar6,1);
        GVar6 = glu::CallLogWrapper::glGetUniformLocation(this_00,GVar5,"g_image_2dms_array");
        glu::CallLogWrapper::glUniform1i(this_00,GVar6,4);
        glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vao);
        iVar8 = 0x10;
        glu::CallLogWrapper::glViewport(this_00,0,0,0x10,0x10);
        glu::CallLogWrapper::glDrawArrays(this_00,5,0,4);
        glu::CallLogWrapper::glActiveTexture(this_00,0x84c0);
        glu::CallLogWrapper::glBindTexture(this_00,0x9100,textures_3[0]);
        glu::CallLogWrapper::glActiveTexture(this_00,0x84c1);
        glu::CallLogWrapper::glBindTexture(this_00,0x9102,textures_3[1]);
        glu::CallLogWrapper::glUseProgram(this_00,program);
        GVar6 = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"g_sampler_2dms");
        glu::CallLogWrapper::glUniform1i(this_00,GVar6,0);
        GVar6 = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"g_sampler_2dms_array");
        glu::CallLogWrapper::glUniform1i(this_00,GVar6,1);
        glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vao);
        glu::CallLogWrapper::glViewport(this_00,0,0,0x10,0x10);
        glu::CallLogWrapper::glMemoryBarrier(this_00,0x20);
        glu::CallLogWrapper::glDrawArrays(this_00,5,0,4);
        os.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
             (_func_int **)0x3f80000000000000;
        os.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = 0x3f80000000000000;
        bVar4 = ShaderImageLoadStoreBase::ValidateReadBuffer
                          (&this->super_ShaderImageLoadStoreBase,0x10,0x10,(int)&os,iVar8,pvVar13);
        if (bVar4) {
          glu::CallLogWrapper::glActiveTexture(this_00,0x84c0);
          glu::CallLogWrapper::glDeleteTextures(this_00,2,textures_3);
          glu::CallLogWrapper::glUseProgram(this_00,0);
          glu::CallLogWrapper::glDeleteProgram(this_00,GVar5);
          glu::CallLogWrapper::glDeleteProgram(this_00,program);
          glu::CallLogWrapper::glGetIntegerv(this_00,0x9110,&isamples);
          if (isamples < 4) {
            return 0;
          }
          local_3f8.m_data[0] = 1.4013e-45;
          local_3f8.m_data[1] = -NAN;
          local_3f8.m_data[2] = 4.2039e-45;
          local_3f8.m_data[3] = -NAN;
          local_408.m_data[0] = 1.4013e-45;
          local_408.m_data[1] = -NAN;
          local_408.m_data[2] = 4.2039e-45;
          local_408.m_data[3] = -NAN;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&os);
          poVar7 = std::operator<<((ostream *)&os,"#version 420 core\nlayout(");
          gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
                    ((string *)textures_3,(void *)0x8d82,e_04);
          poVar7 = std::operator<<(poVar7,(string *)textures_3);
          pcVar11 = ") writeonly uniform ";
          poVar7 = std::operator<<(poVar7,") writeonly uniform ");
          gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>
                    ((string *)&data,pcVar11);
          poVar7 = std::operator<<(poVar7,(string *)&data);
          poVar7 = std::operator<<(poVar7,"image2DMS g_image_2dms;\nlayout(");
          gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
                    (&local_338,(void *)0x8d82,e_05);
          poVar7 = std::operator<<(poVar7,(string *)&local_338);
          pcVar11 = ") writeonly uniform ";
          poVar7 = std::operator<<(poVar7,") writeonly uniform ");
          gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>
                    (&local_358,pcVar11);
          poVar7 = std::operator<<(poVar7,(string *)&local_358);
          pcVar11 = 
          "image2DMSArray g_image_2dms_array;\nvoid main() {\n  ivec2 coord = ivec2(gl_FragCoord.xy);\n  imageStore(g_image_2dms, coord, 0, "
          ;
          poVar7 = std::operator<<(poVar7,
                                   "image2DMSArray g_image_2dms_array;\nvoid main() {\n  ivec2 coord = ivec2(gl_FragCoord.xy);\n  imageStore(g_image_2dms, coord, 0, "
                                  );
          gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>
                    ((string *)textures,pcVar11);
          poVar7 = std::operator<<(poVar7,(string *)textures);
          poVar7 = std::operator<<(poVar7,"vec4");
          poVar7 = tcu::operator<<(poVar7,(Vector<int,_4> *)&local_3f8);
          pcVar11 = ");\n  imageStore(g_image_2dms, coord, 1, ";
          poVar7 = std::operator<<(poVar7,");\n  imageStore(g_image_2dms, coord, 1, ");
          gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>
                    (&local_1f8,pcVar11);
          poVar7 = std::operator<<(poVar7,(string *)&local_1f8);
          poVar7 = std::operator<<(poVar7,"vec4");
          poVar7 = tcu::operator<<(poVar7,(Vector<int,_4> *)&local_3f8);
          pcVar11 = ");\n  imageStore(g_image_2dms, coord, 2, ";
          poVar7 = std::operator<<(poVar7,");\n  imageStore(g_image_2dms, coord, 2, ");
          gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>
                    (&local_218,pcVar11);
          poVar7 = std::operator<<(poVar7,(string *)&local_218);
          poVar7 = std::operator<<(poVar7,"vec4");
          poVar7 = tcu::operator<<(poVar7,(Vector<int,_4> *)&local_3f8);
          pcVar11 = ");\n  imageStore(g_image_2dms, coord, 3, ";
          poVar7 = std::operator<<(poVar7,");\n  imageStore(g_image_2dms, coord, 3, ");
          gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>
                    (&local_238,pcVar11);
          poVar7 = std::operator<<(poVar7,(string *)&local_238);
          poVar7 = std::operator<<(poVar7,"vec4");
          poVar7 = tcu::operator<<(poVar7,(Vector<int,_4> *)&local_3f8);
          pcVar11 = ");\n  imageStore(g_image_2dms_array, ivec3(coord, 0), 0, ";
          poVar7 = std::operator<<(poVar7,
                                   ");\n  imageStore(g_image_2dms_array, ivec3(coord, 0), 0, ");
          gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>
                    (&local_258,pcVar11);
          poVar7 = std::operator<<(poVar7,(string *)&local_258);
          poVar7 = std::operator<<(poVar7,"vec4");
          poVar7 = tcu::operator<<(poVar7,(Vector<int,_4> *)&local_3f8);
          pcVar11 = ");\n  imageStore(g_image_2dms_array, ivec3(coord, 0), 1, ";
          poVar7 = std::operator<<(poVar7,
                                   ");\n  imageStore(g_image_2dms_array, ivec3(coord, 0), 1, ");
          gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>
                    (&local_278,pcVar11);
          poVar7 = std::operator<<(poVar7,(string *)&local_278);
          poVar7 = std::operator<<(poVar7,"vec4");
          poVar7 = tcu::operator<<(poVar7,(Vector<int,_4> *)&local_3f8);
          pcVar11 = ");\n  imageStore(g_image_2dms_array, ivec3(coord, 0), 2, ";
          poVar7 = std::operator<<(poVar7,
                                   ");\n  imageStore(g_image_2dms_array, ivec3(coord, 0), 2, ");
          gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>
                    (&local_298,pcVar11);
          poVar7 = std::operator<<(poVar7,(string *)&local_298);
          poVar7 = std::operator<<(poVar7,"vec4");
          poVar7 = tcu::operator<<(poVar7,(Vector<int,_4> *)&local_3f8);
          pcVar11 = ");\n  imageStore(g_image_2dms_array, ivec3(coord, 0), 3, ";
          poVar7 = std::operator<<(poVar7,
                                   ");\n  imageStore(g_image_2dms_array, ivec3(coord, 0), 3, ");
          gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>
                    (&local_2b8,pcVar11);
          poVar7 = std::operator<<(poVar7,(string *)&local_2b8);
          poVar7 = std::operator<<(poVar7,"vec4");
          poVar7 = tcu::operator<<(poVar7,(Vector<int,_4> *)&local_3f8);
          pcVar11 = ");\n  imageStore(g_image_2dms_array, ivec3(coord, 1), 0, ";
          poVar7 = std::operator<<(poVar7,
                                   ");\n  imageStore(g_image_2dms_array, ivec3(coord, 1), 0, ");
          gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>
                    (&local_2d8,pcVar11);
          poVar7 = std::operator<<(poVar7,(string *)&local_2d8);
          poVar7 = std::operator<<(poVar7,"vec4");
          poVar7 = tcu::operator<<(poVar7,(Vector<int,_4> *)&local_3f8);
          pcVar11 = ");\n  imageStore(g_image_2dms_array, ivec3(coord, 1), 1, ";
          poVar7 = std::operator<<(poVar7,
                                   ");\n  imageStore(g_image_2dms_array, ivec3(coord, 1), 1, ");
          gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>
                    (&local_2f8,pcVar11);
          poVar7 = std::operator<<(poVar7,(string *)&local_2f8);
          poVar7 = std::operator<<(poVar7,"vec4");
          poVar7 = tcu::operator<<(poVar7,(Vector<int,_4> *)&local_3f8);
          pcVar11 = ");\n  imageStore(g_image_2dms_array, ivec3(coord, 1), 2, ";
          poVar7 = std::operator<<(poVar7,
                                   ");\n  imageStore(g_image_2dms_array, ivec3(coord, 1), 2, ");
          gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>
                    (&local_318,pcVar11);
          poVar7 = std::operator<<(poVar7,(string *)&local_318);
          poVar7 = std::operator<<(poVar7,"vec4");
          poVar7 = tcu::operator<<(poVar7,(Vector<int,_4> *)&local_3f8);
          pcVar11 = ");\n  imageStore(g_image_2dms_array, ivec3(coord, 1), 3, ";
          poVar7 = std::operator<<(poVar7,
                                   ");\n  imageStore(g_image_2dms_array, ivec3(coord, 1), 3, ");
          gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>
                    (&local_3a8,pcVar11);
          poVar7 = std::operator<<(poVar7,(string *)&local_3a8);
          poVar7 = std::operator<<(poVar7,"vec4");
          poVar7 = tcu::operator<<(poVar7,(Vector<int,_4> *)&local_3f8);
          std::operator<<(poVar7,");\n  discard;\n}");
          std::__cxx11::string::~string((string *)&local_3a8);
          std::__cxx11::string::~string((string *)&local_318);
          std::__cxx11::string::~string((string *)&local_2f8);
          std::__cxx11::string::~string((string *)&local_2d8);
          std::__cxx11::string::~string((string *)&local_2b8);
          std::__cxx11::string::~string((string *)&local_298);
          std::__cxx11::string::~string((string *)&local_278);
          std::__cxx11::string::~string((string *)&local_258);
          std::__cxx11::string::~string((string *)&local_238);
          std::__cxx11::string::~string((string *)&local_218);
          std::__cxx11::string::~string((string *)&local_1f8);
          std::__cxx11::string::~string((string *)textures);
          std::__cxx11::string::~string((string *)&local_358);
          std::__cxx11::string::~string((string *)&local_338);
          std::__cxx11::string::~string((string *)&data);
          std::__cxx11::string::~string((string *)textures_3);
          std::__cxx11::stringbuf::str();
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&os);
          GVar5 = ShaderImageLoadStoreBase::BuildProgram
                            (&this->super_ShaderImageLoadStoreBase,
                             "#version 420 core\nlayout(location = 0) in vec4 i_position;\nvoid main() {\n  gl_Position = i_position;\n}"
                             ,(char *)0x0,(char *)0x0,(char *)0x0,(char *)local_1d8[0].m_data._0_8_,
                             (bool *)0x0);
          std::__cxx11::string::~string((string *)local_1d8);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&os);
          pcVar11 = "#version 420 core\nlayout(location = 0) out vec4 o_color;\nuniform ";
          poVar7 = std::operator<<((ostream *)&os,
                                   "#version 420 core\nlayout(location = 0) out vec4 o_color;\nuniform "
                                  );
          gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>
                    ((string *)textures_3,pcVar11);
          poVar7 = std::operator<<(poVar7,(string *)textures_3);
          pcVar11 = "sampler2DMS g_sampler_2dms;\nuniform ";
          poVar7 = std::operator<<(poVar7,"sampler2DMS g_sampler_2dms;\nuniform ");
          gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>
                    ((string *)&data,pcVar11);
          poVar7 = std::operator<<(poVar7,(string *)&data);
          pcVar11 = 
          "sampler2DMSArray g_sampler_2dms_array;\nvoid main() {\n  o_color = vec4(0.0, 1.0, 0.0, 1.0);\n  ivec2 coord = ivec2(gl_FragCoord.xy);\n  if (texelFetch(g_sampler_2dms, coord, 0) != "
          ;
          poVar7 = std::operator<<(poVar7,
                                   "sampler2DMSArray g_sampler_2dms_array;\nvoid main() {\n  o_color = vec4(0.0, 1.0, 0.0, 1.0);\n  ivec2 coord = ivec2(gl_FragCoord.xy);\n  if (texelFetch(g_sampler_2dms, coord, 0) != "
                                  );
          gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>
                    (&local_338,pcVar11);
          poVar7 = std::operator<<(poVar7,(string *)&local_338);
          poVar7 = std::operator<<(poVar7,"vec4");
          poVar7 = tcu::operator<<(poVar7,(Vector<int,_4> *)&local_408);
          pcVar11 = 
          ") o_color = vec4(1.0, 0.0, 0.0, 0.1);\n  if (texelFetch(g_sampler_2dms, coord, 1) != ";
          poVar7 = std::operator<<(poVar7,
                                   ") o_color = vec4(1.0, 0.0, 0.0, 0.1);\n  if (texelFetch(g_sampler_2dms, coord, 1) != "
                                  );
          gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>
                    (&local_358,pcVar11);
          poVar7 = std::operator<<(poVar7,(string *)&local_358);
          poVar7 = std::operator<<(poVar7,"vec4");
          poVar7 = tcu::operator<<(poVar7,(Vector<int,_4> *)&local_408);
          pcVar11 = 
          ") o_color = vec4(1.0, 0.0, 0.0, 0.1);\n  if (texelFetch(g_sampler_2dms, coord, 2) != ";
          poVar7 = std::operator<<(poVar7,
                                   ") o_color = vec4(1.0, 0.0, 0.0, 0.1);\n  if (texelFetch(g_sampler_2dms, coord, 2) != "
                                  );
          gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>
                    ((string *)textures,pcVar11);
          poVar7 = std::operator<<(poVar7,(string *)textures);
          poVar7 = std::operator<<(poVar7,"vec4");
          poVar7 = tcu::operator<<(poVar7,(Vector<int,_4> *)&local_408);
          pcVar11 = 
          ") o_color = vec4(1.0, 0.0, 0.0, 0.1);\n  if (texelFetch(g_sampler_2dms, coord, 3) != ";
          poVar7 = std::operator<<(poVar7,
                                   ") o_color = vec4(1.0, 0.0, 0.0, 0.1);\n  if (texelFetch(g_sampler_2dms, coord, 3) != "
                                  );
          gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>
                    (&local_1f8,pcVar11);
          poVar7 = std::operator<<(poVar7,(string *)&local_1f8);
          poVar7 = std::operator<<(poVar7,"vec4");
          poVar7 = tcu::operator<<(poVar7,(Vector<int,_4> *)&local_408);
          pcVar11 = 
          ") o_color = vec4(1.0, 0.0, 0.0, 0.1);\n  if (texelFetch(g_sampler_2dms_array, ivec3(coord, 0), 0) != "
          ;
          poVar7 = std::operator<<(poVar7,
                                   ") o_color = vec4(1.0, 0.0, 0.0, 0.1);\n  if (texelFetch(g_sampler_2dms_array, ivec3(coord, 0), 0) != "
                                  );
          gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>
                    (&local_218,pcVar11);
          poVar7 = std::operator<<(poVar7,(string *)&local_218);
          poVar7 = std::operator<<(poVar7,"vec4");
          poVar7 = tcu::operator<<(poVar7,(Vector<int,_4> *)&local_408);
          pcVar11 = 
          ") o_color = vec4(1.0, 0.0, 0.0, 0.2);\n  if (texelFetch(g_sampler_2dms_array, ivec3(coord, 0), 1) != "
          ;
          poVar7 = std::operator<<(poVar7,
                                   ") o_color = vec4(1.0, 0.0, 0.0, 0.2);\n  if (texelFetch(g_sampler_2dms_array, ivec3(coord, 0), 1) != "
                                  );
          gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>
                    (&local_238,pcVar11);
          poVar7 = std::operator<<(poVar7,(string *)&local_238);
          poVar7 = std::operator<<(poVar7,"vec4");
          poVar7 = tcu::operator<<(poVar7,(Vector<int,_4> *)&local_408);
          pcVar11 = 
          ") o_color = vec4(1.0, 0.0, 0.0, 0.2);\n  if (texelFetch(g_sampler_2dms_array, ivec3(coord, 0), 2) != "
          ;
          poVar7 = std::operator<<(poVar7,
                                   ") o_color = vec4(1.0, 0.0, 0.0, 0.2);\n  if (texelFetch(g_sampler_2dms_array, ivec3(coord, 0), 2) != "
                                  );
          gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>
                    (&local_258,pcVar11);
          poVar7 = std::operator<<(poVar7,(string *)&local_258);
          poVar7 = std::operator<<(poVar7,"vec4");
          poVar7 = tcu::operator<<(poVar7,(Vector<int,_4> *)&local_408);
          pcVar11 = 
          ") o_color = vec4(1.0, 0.0, 0.0, 0.2);\n  if (texelFetch(g_sampler_2dms_array, ivec3(coord, 0), 3) != "
          ;
          poVar7 = std::operator<<(poVar7,
                                   ") o_color = vec4(1.0, 0.0, 0.0, 0.2);\n  if (texelFetch(g_sampler_2dms_array, ivec3(coord, 0), 3) != "
                                  );
          gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>
                    (&local_278,pcVar11);
          poVar7 = std::operator<<(poVar7,(string *)&local_278);
          poVar7 = std::operator<<(poVar7,"vec4");
          poVar7 = tcu::operator<<(poVar7,(Vector<int,_4> *)&local_408);
          pcVar11 = 
          ") o_color = vec4(1.0, 0.0, 0.0, 0.2);\n  if (texelFetch(g_sampler_2dms_array, ivec3(coord, 1), 0) != "
          ;
          poVar7 = std::operator<<(poVar7,
                                   ") o_color = vec4(1.0, 0.0, 0.0, 0.2);\n  if (texelFetch(g_sampler_2dms_array, ivec3(coord, 1), 0) != "
                                  );
          gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>
                    (&local_298,pcVar11);
          poVar7 = std::operator<<(poVar7,(string *)&local_298);
          poVar7 = std::operator<<(poVar7,"vec4");
          poVar7 = tcu::operator<<(poVar7,(Vector<int,_4> *)&local_408);
          pcVar11 = 
          ") o_color = vec4(1.0, 0.0, 0.0, 0.3);\n  if (texelFetch(g_sampler_2dms_array, ivec3(coord, 1), 1) != "
          ;
          poVar7 = std::operator<<(poVar7,
                                   ") o_color = vec4(1.0, 0.0, 0.0, 0.3);\n  if (texelFetch(g_sampler_2dms_array, ivec3(coord, 1), 1) != "
                                  );
          gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>
                    (&local_2b8,pcVar11);
          poVar7 = std::operator<<(poVar7,(string *)&local_2b8);
          poVar7 = std::operator<<(poVar7,"vec4");
          poVar7 = tcu::operator<<(poVar7,(Vector<int,_4> *)&local_408);
          pcVar11 = 
          ") o_color = vec4(1.0, 0.0, 0.0, 0.3);\n  if (texelFetch(g_sampler_2dms_array, ivec3(coord, 1), 2) != "
          ;
          poVar7 = std::operator<<(poVar7,
                                   ") o_color = vec4(1.0, 0.0, 0.0, 0.3);\n  if (texelFetch(g_sampler_2dms_array, ivec3(coord, 1), 2) != "
                                  );
          gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>
                    (&local_2d8,pcVar11);
          poVar7 = std::operator<<(poVar7,(string *)&local_2d8);
          poVar7 = std::operator<<(poVar7,"vec4");
          poVar7 = tcu::operator<<(poVar7,(Vector<int,_4> *)&local_408);
          pcVar11 = 
          ") o_color = vec4(1.0, 0.0, 0.0, 0.3);\n  if (texelFetch(g_sampler_2dms_array, ivec3(coord, 1), 3) != "
          ;
          poVar7 = std::operator<<(poVar7,
                                   ") o_color = vec4(1.0, 0.0, 0.0, 0.3);\n  if (texelFetch(g_sampler_2dms_array, ivec3(coord, 1), 3) != "
                                  );
          gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>
                    (&local_2f8,pcVar11);
          poVar7 = std::operator<<(poVar7,(string *)&local_2f8);
          poVar7 = std::operator<<(poVar7,"vec4");
          poVar7 = tcu::operator<<(poVar7,(Vector<int,_4> *)&local_408);
          std::operator<<(poVar7,") o_color = vec4(1.0, 0.0, 0.0, 0.3);\n}");
          std::__cxx11::string::~string((string *)&local_2f8);
          std::__cxx11::string::~string((string *)&local_2d8);
          std::__cxx11::string::~string((string *)&local_2b8);
          std::__cxx11::string::~string((string *)&local_298);
          std::__cxx11::string::~string((string *)&local_278);
          std::__cxx11::string::~string((string *)&local_258);
          std::__cxx11::string::~string((string *)&local_238);
          std::__cxx11::string::~string((string *)&local_218);
          std::__cxx11::string::~string((string *)&local_1f8);
          std::__cxx11::string::~string((string *)textures);
          std::__cxx11::string::~string((string *)&local_358);
          std::__cxx11::string::~string((string *)&local_338);
          std::__cxx11::string::~string((string *)&data);
          std::__cxx11::string::~string((string *)textures_3);
          std::__cxx11::stringbuf::str();
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&os);
          program = ShaderImageLoadStoreBase::BuildProgram
                              (&this->super_ShaderImageLoadStoreBase,
                               "#version 420 core\nlayout(location = 0) in vec4 i_position;\nvoid main() {\n  gl_Position = i_position;\n}"
                               ,(char *)0x0,(char *)0x0,(char *)0x0,local_318._M_dataplus._M_p,
                               (bool *)0x0);
          std::__cxx11::string::~string((string *)&local_318);
          glu::CallLogWrapper::glGenTextures(this_00,2,textures_3);
          glu::CallLogWrapper::glBindTexture(this_00,0x9100,textures_3[0]);
          glu::CallLogWrapper::glTexImage2DMultisample(this_00,0x9100,4,0x8d82,0x10,0x10,'\0');
          glu::CallLogWrapper::glBindTexture(this_00,0x9100,0);
          glu::CallLogWrapper::glBindTexture(this_00,0x9102,textures_3[1]);
          glu::CallLogWrapper::glTexImage3DMultisample(this_00,0x9102,4,0x8d82,0x10,0x10,2,'\0');
          glu::CallLogWrapper::glBindTexture(this_00,0x9102,0);
          glu::CallLogWrapper::glBindImageTexture(this_00,1,textures_3[0],0,'\0',0,0x88b9,0x8d82);
          pvVar13 = (vec4 *)0x0;
          glu::CallLogWrapper::glBindImageTexture(this_00,4,textures_3[1],0,'\x01',0,0x88b9,0x8d82);
          glu::CallLogWrapper::glClear(this_00,0x4000);
          glu::CallLogWrapper::glUseProgram(this_00,GVar5);
          GVar6 = glu::CallLogWrapper::glGetUniformLocation(this_00,GVar5,"g_image_2dms");
          glu::CallLogWrapper::glUniform1i(this_00,GVar6,1);
          GVar6 = glu::CallLogWrapper::glGetUniformLocation(this_00,GVar5,"g_image_2dms_array");
          glu::CallLogWrapper::glUniform1i(this_00,GVar6,4);
          glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vao);
          iVar8 = 0x10;
          glu::CallLogWrapper::glViewport(this_00,0,0,0x10,0x10);
          glu::CallLogWrapper::glDrawArrays(this_00,5,0,4);
          glu::CallLogWrapper::glActiveTexture(this_00,0x84c0);
          glu::CallLogWrapper::glBindTexture(this_00,0x9100,textures_3[0]);
          glu::CallLogWrapper::glActiveTexture(this_00,0x84c1);
          glu::CallLogWrapper::glBindTexture(this_00,0x9102,textures_3[1]);
          glu::CallLogWrapper::glUseProgram(this_00,program);
          GVar6 = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"g_sampler_2dms");
          glu::CallLogWrapper::glUniform1i(this_00,GVar6,0);
          GVar6 = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"g_sampler_2dms_array");
          glu::CallLogWrapper::glUniform1i(this_00,GVar6,1);
          glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vao);
          glu::CallLogWrapper::glViewport(this_00,0,0,0x10,0x10);
          glu::CallLogWrapper::glMemoryBarrier(this_00,0x20);
          glu::CallLogWrapper::glDrawArrays(this_00,5,0,4);
          os.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
               (_func_int **)0x3f80000000000000;
          os.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = 0x3f80000000000000;
          bVar4 = ShaderImageLoadStoreBase::ValidateReadBuffer
                            (&this->super_ShaderImageLoadStoreBase,0x10,0x10,(int)&os,iVar8,pvVar13)
          ;
          if (bVar4) {
            glu::CallLogWrapper::glActiveTexture(this_00,0x84c0);
            glu::CallLogWrapper::glDeleteTextures(this_00,2,textures_3);
            glu::CallLogWrapper::glUseProgram(this_00,0);
            glu::CallLogWrapper::glDeleteProgram(this_00,GVar5);
            glu::CallLogWrapper::glDeleteProgram(this_00,program);
            local_3f8.m_data[0] = 1.4013e-45;
            local_3f8.m_data[1] = 2.8026e-45;
            local_3f8.m_data[2] = 4.2039e-45;
            local_3f8.m_data[3] = 5.60519e-45;
            local_408.m_data[0] = 1.4013e-45;
            local_408.m_data[1] = 2.8026e-45;
            local_408.m_data[2] = 4.2039e-45;
            local_408.m_data[3] = 5.60519e-45;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&os);
            poVar7 = std::operator<<((ostream *)&os,"#version 420 core\nlayout(");
            gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
                      ((string *)textures_3,(void *)0x8d70,e_06);
            poVar7 = std::operator<<(poVar7,(string *)textures_3);
            pcVar11 = ") writeonly uniform ";
            poVar7 = std::operator<<(poVar7,") writeonly uniform ");
            gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::
            TypePrefix<tcu::Vector<unsigned_int,4>>((string *)&data,pcVar11);
            poVar7 = std::operator<<(poVar7,(string *)&data);
            poVar7 = std::operator<<(poVar7,"image2DMS g_image_2dms;\nlayout(");
            gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
                      (&local_338,(void *)0x8d70,e_07);
            poVar7 = std::operator<<(poVar7,(string *)&local_338);
            pcVar11 = ") writeonly uniform ";
            poVar7 = std::operator<<(poVar7,") writeonly uniform ");
            gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::
            TypePrefix<tcu::Vector<unsigned_int,4>>(&local_358,pcVar11);
            poVar7 = std::operator<<(poVar7,(string *)&local_358);
            pcVar11 = 
            "image2DMSArray g_image_2dms_array;\nvoid main() {\n  ivec2 coord = ivec2(gl_FragCoord.xy);\n  imageStore(g_image_2dms, coord, 0, "
            ;
            poVar7 = std::operator<<(poVar7,
                                     "image2DMSArray g_image_2dms_array;\nvoid main() {\n  ivec2 coord = ivec2(gl_FragCoord.xy);\n  imageStore(g_image_2dms, coord, 0, "
                                    );
            gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::
            TypePrefix<tcu::Vector<unsigned_int,4>>((string *)textures,pcVar11);
            poVar7 = std::operator<<(poVar7,(string *)textures);
            poVar7 = std::operator<<(poVar7,"vec4");
            poVar7 = tcu::operator<<(poVar7,(Vector<unsigned_int,_4> *)&local_3f8);
            pcVar11 = ");\n  imageStore(g_image_2dms, coord, 1, ";
            poVar7 = std::operator<<(poVar7,");\n  imageStore(g_image_2dms, coord, 1, ");
            gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::
            TypePrefix<tcu::Vector<unsigned_int,4>>(&local_1f8,pcVar11);
            poVar7 = std::operator<<(poVar7,(string *)&local_1f8);
            poVar7 = std::operator<<(poVar7,"vec4");
            poVar7 = tcu::operator<<(poVar7,(Vector<unsigned_int,_4> *)&local_3f8);
            pcVar11 = ");\n  imageStore(g_image_2dms, coord, 2, ";
            poVar7 = std::operator<<(poVar7,");\n  imageStore(g_image_2dms, coord, 2, ");
            gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::
            TypePrefix<tcu::Vector<unsigned_int,4>>(&local_218,pcVar11);
            poVar7 = std::operator<<(poVar7,(string *)&local_218);
            poVar7 = std::operator<<(poVar7,"vec4");
            poVar7 = tcu::operator<<(poVar7,(Vector<unsigned_int,_4> *)&local_3f8);
            pcVar11 = ");\n  imageStore(g_image_2dms, coord, 3, ";
            poVar7 = std::operator<<(poVar7,");\n  imageStore(g_image_2dms, coord, 3, ");
            gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::
            TypePrefix<tcu::Vector<unsigned_int,4>>(&local_238,pcVar11);
            poVar7 = std::operator<<(poVar7,(string *)&local_238);
            poVar7 = std::operator<<(poVar7,"vec4");
            poVar7 = tcu::operator<<(poVar7,(Vector<unsigned_int,_4> *)&local_3f8);
            pcVar11 = ");\n  imageStore(g_image_2dms_array, ivec3(coord, 0), 0, ";
            poVar7 = std::operator<<(poVar7,
                                     ");\n  imageStore(g_image_2dms_array, ivec3(coord, 0), 0, ");
            gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::
            TypePrefix<tcu::Vector<unsigned_int,4>>(&local_258,pcVar11);
            poVar7 = std::operator<<(poVar7,(string *)&local_258);
            poVar7 = std::operator<<(poVar7,"vec4");
            poVar7 = tcu::operator<<(poVar7,(Vector<unsigned_int,_4> *)&local_3f8);
            pcVar11 = ");\n  imageStore(g_image_2dms_array, ivec3(coord, 0), 1, ";
            poVar7 = std::operator<<(poVar7,
                                     ");\n  imageStore(g_image_2dms_array, ivec3(coord, 0), 1, ");
            gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::
            TypePrefix<tcu::Vector<unsigned_int,4>>(&local_278,pcVar11);
            poVar7 = std::operator<<(poVar7,(string *)&local_278);
            poVar7 = std::operator<<(poVar7,"vec4");
            poVar7 = tcu::operator<<(poVar7,(Vector<unsigned_int,_4> *)&local_3f8);
            pcVar11 = ");\n  imageStore(g_image_2dms_array, ivec3(coord, 0), 2, ";
            poVar7 = std::operator<<(poVar7,
                                     ");\n  imageStore(g_image_2dms_array, ivec3(coord, 0), 2, ");
            gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::
            TypePrefix<tcu::Vector<unsigned_int,4>>(&local_298,pcVar11);
            poVar7 = std::operator<<(poVar7,(string *)&local_298);
            poVar7 = std::operator<<(poVar7,"vec4");
            poVar7 = tcu::operator<<(poVar7,(Vector<unsigned_int,_4> *)&local_3f8);
            pcVar11 = ");\n  imageStore(g_image_2dms_array, ivec3(coord, 0), 3, ";
            poVar7 = std::operator<<(poVar7,
                                     ");\n  imageStore(g_image_2dms_array, ivec3(coord, 0), 3, ");
            gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::
            TypePrefix<tcu::Vector<unsigned_int,4>>(&local_2b8,pcVar11);
            poVar7 = std::operator<<(poVar7,(string *)&local_2b8);
            poVar7 = std::operator<<(poVar7,"vec4");
            poVar7 = tcu::operator<<(poVar7,(Vector<unsigned_int,_4> *)&local_3f8);
            pcVar11 = ");\n  imageStore(g_image_2dms_array, ivec3(coord, 1), 0, ";
            poVar7 = std::operator<<(poVar7,
                                     ");\n  imageStore(g_image_2dms_array, ivec3(coord, 1), 0, ");
            gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::
            TypePrefix<tcu::Vector<unsigned_int,4>>(&local_2d8,pcVar11);
            poVar7 = std::operator<<(poVar7,(string *)&local_2d8);
            poVar7 = std::operator<<(poVar7,"vec4");
            poVar7 = tcu::operator<<(poVar7,(Vector<unsigned_int,_4> *)&local_3f8);
            pcVar11 = ");\n  imageStore(g_image_2dms_array, ivec3(coord, 1), 1, ";
            poVar7 = std::operator<<(poVar7,
                                     ");\n  imageStore(g_image_2dms_array, ivec3(coord, 1), 1, ");
            gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::
            TypePrefix<tcu::Vector<unsigned_int,4>>(&local_2f8,pcVar11);
            poVar7 = std::operator<<(poVar7,(string *)&local_2f8);
            poVar7 = std::operator<<(poVar7,"vec4");
            poVar7 = tcu::operator<<(poVar7,(Vector<unsigned_int,_4> *)&local_3f8);
            pcVar11 = ");\n  imageStore(g_image_2dms_array, ivec3(coord, 1), 2, ";
            poVar7 = std::operator<<(poVar7,
                                     ");\n  imageStore(g_image_2dms_array, ivec3(coord, 1), 2, ");
            gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::
            TypePrefix<tcu::Vector<unsigned_int,4>>(&local_318,pcVar11);
            poVar7 = std::operator<<(poVar7,(string *)&local_318);
            poVar7 = std::operator<<(poVar7,"vec4");
            poVar7 = tcu::operator<<(poVar7,(Vector<unsigned_int,_4> *)&local_3f8);
            pcVar11 = ");\n  imageStore(g_image_2dms_array, ivec3(coord, 1), 3, ";
            poVar7 = std::operator<<(poVar7,
                                     ");\n  imageStore(g_image_2dms_array, ivec3(coord, 1), 3, ");
            gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::
            TypePrefix<tcu::Vector<unsigned_int,4>>(&local_3a8,pcVar11);
            poVar7 = std::operator<<(poVar7,(string *)&local_3a8);
            poVar7 = std::operator<<(poVar7,"vec4");
            poVar7 = tcu::operator<<(poVar7,(Vector<unsigned_int,_4> *)&local_3f8);
            std::operator<<(poVar7,");\n  discard;\n}");
            std::__cxx11::string::~string((string *)&local_3a8);
            std::__cxx11::string::~string((string *)&local_318);
            std::__cxx11::string::~string((string *)&local_2f8);
            std::__cxx11::string::~string((string *)&local_2d8);
            std::__cxx11::string::~string((string *)&local_2b8);
            std::__cxx11::string::~string((string *)&local_298);
            std::__cxx11::string::~string((string *)&local_278);
            std::__cxx11::string::~string((string *)&local_258);
            std::__cxx11::string::~string((string *)&local_238);
            std::__cxx11::string::~string((string *)&local_218);
            std::__cxx11::string::~string((string *)&local_1f8);
            std::__cxx11::string::~string((string *)textures);
            std::__cxx11::string::~string((string *)&local_358);
            std::__cxx11::string::~string((string *)&local_338);
            std::__cxx11::string::~string((string *)&data);
            std::__cxx11::string::~string((string *)textures_3);
            std::__cxx11::stringbuf::str();
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&os);
            GVar5 = ShaderImageLoadStoreBase::BuildProgram
                              (&this->super_ShaderImageLoadStoreBase,
                               "#version 420 core\nlayout(location = 0) in vec4 i_position;\nvoid main() {\n  gl_Position = i_position;\n}"
                               ,(char *)0x0,(char *)0x0,(char *)0x0,
                               (char *)local_1d8[0].m_data._0_8_,(bool *)0x0);
            std::__cxx11::string::~string((string *)local_1d8);
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&os);
            pcVar11 = "#version 420 core\nlayout(location = 0) out vec4 o_color;\nuniform ";
            poVar7 = std::operator<<((ostream *)&os,
                                     "#version 420 core\nlayout(location = 0) out vec4 o_color;\nuniform "
                                    );
            gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::
            TypePrefix<tcu::Vector<unsigned_int,4>>((string *)textures_3,pcVar11);
            poVar7 = std::operator<<(poVar7,(string *)textures_3);
            pcVar11 = "sampler2DMS g_sampler_2dms;\nuniform ";
            poVar7 = std::operator<<(poVar7,"sampler2DMS g_sampler_2dms;\nuniform ");
            gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::
            TypePrefix<tcu::Vector<unsigned_int,4>>((string *)&data,pcVar11);
            poVar7 = std::operator<<(poVar7,(string *)&data);
            pcVar11 = 
            "sampler2DMSArray g_sampler_2dms_array;\nvoid main() {\n  o_color = vec4(0.0, 1.0, 0.0, 1.0);\n  ivec2 coord = ivec2(gl_FragCoord.xy);\n  if (texelFetch(g_sampler_2dms, coord, 0) != "
            ;
            poVar7 = std::operator<<(poVar7,
                                     "sampler2DMSArray g_sampler_2dms_array;\nvoid main() {\n  o_color = vec4(0.0, 1.0, 0.0, 1.0);\n  ivec2 coord = ivec2(gl_FragCoord.xy);\n  if (texelFetch(g_sampler_2dms, coord, 0) != "
                                    );
            gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::
            TypePrefix<tcu::Vector<unsigned_int,4>>(&local_338,pcVar11);
            poVar7 = std::operator<<(poVar7,(string *)&local_338);
            poVar7 = std::operator<<(poVar7,"vec4");
            poVar7 = tcu::operator<<(poVar7,(Vector<unsigned_int,_4> *)&local_408);
            pcVar11 = 
            ") o_color = vec4(1.0, 0.0, 0.0, 0.1);\n  if (texelFetch(g_sampler_2dms, coord, 1) != ";
            poVar7 = std::operator<<(poVar7,
                                     ") o_color = vec4(1.0, 0.0, 0.0, 0.1);\n  if (texelFetch(g_sampler_2dms, coord, 1) != "
                                    );
            gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::
            TypePrefix<tcu::Vector<unsigned_int,4>>(&local_358,pcVar11);
            poVar7 = std::operator<<(poVar7,(string *)&local_358);
            poVar7 = std::operator<<(poVar7,"vec4");
            poVar7 = tcu::operator<<(poVar7,(Vector<unsigned_int,_4> *)&local_408);
            pcVar11 = 
            ") o_color = vec4(1.0, 0.0, 0.0, 0.1);\n  if (texelFetch(g_sampler_2dms, coord, 2) != ";
            poVar7 = std::operator<<(poVar7,
                                     ") o_color = vec4(1.0, 0.0, 0.0, 0.1);\n  if (texelFetch(g_sampler_2dms, coord, 2) != "
                                    );
            gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::
            TypePrefix<tcu::Vector<unsigned_int,4>>((string *)textures,pcVar11);
            poVar7 = std::operator<<(poVar7,(string *)textures);
            poVar7 = std::operator<<(poVar7,"vec4");
            poVar7 = tcu::operator<<(poVar7,(Vector<unsigned_int,_4> *)&local_408);
            pcVar11 = 
            ") o_color = vec4(1.0, 0.0, 0.0, 0.1);\n  if (texelFetch(g_sampler_2dms, coord, 3) != ";
            poVar7 = std::operator<<(poVar7,
                                     ") o_color = vec4(1.0, 0.0, 0.0, 0.1);\n  if (texelFetch(g_sampler_2dms, coord, 3) != "
                                    );
            gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::
            TypePrefix<tcu::Vector<unsigned_int,4>>(&local_1f8,pcVar11);
            poVar7 = std::operator<<(poVar7,(string *)&local_1f8);
            poVar7 = std::operator<<(poVar7,"vec4");
            poVar7 = tcu::operator<<(poVar7,(Vector<unsigned_int,_4> *)&local_408);
            pcVar11 = 
            ") o_color = vec4(1.0, 0.0, 0.0, 0.1);\n  if (texelFetch(g_sampler_2dms_array, ivec3(coord, 0), 0) != "
            ;
            poVar7 = std::operator<<(poVar7,
                                     ") o_color = vec4(1.0, 0.0, 0.0, 0.1);\n  if (texelFetch(g_sampler_2dms_array, ivec3(coord, 0), 0) != "
                                    );
            gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::
            TypePrefix<tcu::Vector<unsigned_int,4>>(&local_218,pcVar11);
            poVar7 = std::operator<<(poVar7,(string *)&local_218);
            poVar7 = std::operator<<(poVar7,"vec4");
            poVar7 = tcu::operator<<(poVar7,(Vector<unsigned_int,_4> *)&local_408);
            pcVar11 = 
            ") o_color = vec4(1.0, 0.0, 0.0, 0.2);\n  if (texelFetch(g_sampler_2dms_array, ivec3(coord, 0), 1) != "
            ;
            poVar7 = std::operator<<(poVar7,
                                     ") o_color = vec4(1.0, 0.0, 0.0, 0.2);\n  if (texelFetch(g_sampler_2dms_array, ivec3(coord, 0), 1) != "
                                    );
            gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::
            TypePrefix<tcu::Vector<unsigned_int,4>>(&local_238,pcVar11);
            poVar7 = std::operator<<(poVar7,(string *)&local_238);
            poVar7 = std::operator<<(poVar7,"vec4");
            poVar7 = tcu::operator<<(poVar7,(Vector<unsigned_int,_4> *)&local_408);
            pcVar11 = 
            ") o_color = vec4(1.0, 0.0, 0.0, 0.2);\n  if (texelFetch(g_sampler_2dms_array, ivec3(coord, 0), 2) != "
            ;
            poVar7 = std::operator<<(poVar7,
                                     ") o_color = vec4(1.0, 0.0, 0.0, 0.2);\n  if (texelFetch(g_sampler_2dms_array, ivec3(coord, 0), 2) != "
                                    );
            gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::
            TypePrefix<tcu::Vector<unsigned_int,4>>(&local_258,pcVar11);
            poVar7 = std::operator<<(poVar7,(string *)&local_258);
            poVar7 = std::operator<<(poVar7,"vec4");
            poVar7 = tcu::operator<<(poVar7,(Vector<unsigned_int,_4> *)&local_408);
            pcVar11 = 
            ") o_color = vec4(1.0, 0.0, 0.0, 0.2);\n  if (texelFetch(g_sampler_2dms_array, ivec3(coord, 0), 3) != "
            ;
            poVar7 = std::operator<<(poVar7,
                                     ") o_color = vec4(1.0, 0.0, 0.0, 0.2);\n  if (texelFetch(g_sampler_2dms_array, ivec3(coord, 0), 3) != "
                                    );
            gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::
            TypePrefix<tcu::Vector<unsigned_int,4>>(&local_278,pcVar11);
            poVar7 = std::operator<<(poVar7,(string *)&local_278);
            poVar7 = std::operator<<(poVar7,"vec4");
            poVar7 = tcu::operator<<(poVar7,(Vector<unsigned_int,_4> *)&local_408);
            pcVar11 = 
            ") o_color = vec4(1.0, 0.0, 0.0, 0.2);\n  if (texelFetch(g_sampler_2dms_array, ivec3(coord, 1), 0) != "
            ;
            poVar7 = std::operator<<(poVar7,
                                     ") o_color = vec4(1.0, 0.0, 0.0, 0.2);\n  if (texelFetch(g_sampler_2dms_array, ivec3(coord, 1), 0) != "
                                    );
            gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::
            TypePrefix<tcu::Vector<unsigned_int,4>>(&local_298,pcVar11);
            poVar7 = std::operator<<(poVar7,(string *)&local_298);
            poVar7 = std::operator<<(poVar7,"vec4");
            poVar7 = tcu::operator<<(poVar7,(Vector<unsigned_int,_4> *)&local_408);
            pcVar11 = 
            ") o_color = vec4(1.0, 0.0, 0.0, 0.3);\n  if (texelFetch(g_sampler_2dms_array, ivec3(coord, 1), 1) != "
            ;
            poVar7 = std::operator<<(poVar7,
                                     ") o_color = vec4(1.0, 0.0, 0.0, 0.3);\n  if (texelFetch(g_sampler_2dms_array, ivec3(coord, 1), 1) != "
                                    );
            gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::
            TypePrefix<tcu::Vector<unsigned_int,4>>(&local_2b8,pcVar11);
            poVar7 = std::operator<<(poVar7,(string *)&local_2b8);
            poVar7 = std::operator<<(poVar7,"vec4");
            poVar7 = tcu::operator<<(poVar7,(Vector<unsigned_int,_4> *)&local_408);
            pcVar11 = 
            ") o_color = vec4(1.0, 0.0, 0.0, 0.3);\n  if (texelFetch(g_sampler_2dms_array, ivec3(coord, 1), 2) != "
            ;
            poVar7 = std::operator<<(poVar7,
                                     ") o_color = vec4(1.0, 0.0, 0.0, 0.3);\n  if (texelFetch(g_sampler_2dms_array, ivec3(coord, 1), 2) != "
                                    );
            gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::
            TypePrefix<tcu::Vector<unsigned_int,4>>(&local_2d8,pcVar11);
            poVar7 = std::operator<<(poVar7,(string *)&local_2d8);
            poVar7 = std::operator<<(poVar7,"vec4");
            poVar7 = tcu::operator<<(poVar7,(Vector<unsigned_int,_4> *)&local_408);
            pcVar11 = 
            ") o_color = vec4(1.0, 0.0, 0.0, 0.3);\n  if (texelFetch(g_sampler_2dms_array, ivec3(coord, 1), 3) != "
            ;
            poVar7 = std::operator<<(poVar7,
                                     ") o_color = vec4(1.0, 0.0, 0.0, 0.3);\n  if (texelFetch(g_sampler_2dms_array, ivec3(coord, 1), 3) != "
                                    );
            gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::
            TypePrefix<tcu::Vector<unsigned_int,4>>(&local_2f8,pcVar11);
            poVar7 = std::operator<<(poVar7,(string *)&local_2f8);
            poVar7 = std::operator<<(poVar7,"vec4");
            poVar7 = tcu::operator<<(poVar7,(Vector<unsigned_int,_4> *)&local_408);
            std::operator<<(poVar7,") o_color = vec4(1.0, 0.0, 0.0, 0.3);\n}");
            std::__cxx11::string::~string((string *)&local_2f8);
            std::__cxx11::string::~string((string *)&local_2d8);
            std::__cxx11::string::~string((string *)&local_2b8);
            std::__cxx11::string::~string((string *)&local_298);
            std::__cxx11::string::~string((string *)&local_278);
            std::__cxx11::string::~string((string *)&local_258);
            std::__cxx11::string::~string((string *)&local_238);
            std::__cxx11::string::~string((string *)&local_218);
            std::__cxx11::string::~string((string *)&local_1f8);
            std::__cxx11::string::~string((string *)textures);
            std::__cxx11::string::~string((string *)&local_358);
            std::__cxx11::string::~string((string *)&local_338);
            std::__cxx11::string::~string((string *)&data);
            std::__cxx11::string::~string((string *)textures_3);
            std::__cxx11::stringbuf::str();
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&os);
            program = ShaderImageLoadStoreBase::BuildProgram
                                (&this->super_ShaderImageLoadStoreBase,
                                 "#version 420 core\nlayout(location = 0) in vec4 i_position;\nvoid main() {\n  gl_Position = i_position;\n}"
                                 ,(char *)0x0,(char *)0x0,(char *)0x0,local_318._M_dataplus._M_p,
                                 (bool *)0x0);
            std::__cxx11::string::~string((string *)&local_318);
            glu::CallLogWrapper::glGenTextures(this_00,2,textures_3);
            glu::CallLogWrapper::glBindTexture(this_00,0x9100,textures_3[0]);
            glu::CallLogWrapper::glTexImage2DMultisample(this_00,0x9100,4,0x8d70,0x10,0x10,'\0');
            glu::CallLogWrapper::glBindTexture(this_00,0x9100,0);
            glu::CallLogWrapper::glBindTexture(this_00,0x9102,textures_3[1]);
            glu::CallLogWrapper::glTexImage3DMultisample(this_00,0x9102,4,0x8d70,0x10,0x10,2,'\0');
            glu::CallLogWrapper::glBindTexture(this_00,0x9102,0);
            glu::CallLogWrapper::glBindImageTexture(this_00,1,textures_3[0],0,'\0',0,0x88b9,0x8d70);
            pvVar13 = (vec4 *)0x0;
            glu::CallLogWrapper::glBindImageTexture
                      (this_00,4,textures_3[1],0,'\x01',0,0x88b9,0x8d70);
            glu::CallLogWrapper::glClear(this_00,0x4000);
            glu::CallLogWrapper::glUseProgram(this_00,GVar5);
            GVar6 = glu::CallLogWrapper::glGetUniformLocation(this_00,GVar5,"g_image_2dms");
            glu::CallLogWrapper::glUniform1i(this_00,GVar6,1);
            GVar6 = glu::CallLogWrapper::glGetUniformLocation(this_00,GVar5,"g_image_2dms_array");
            glu::CallLogWrapper::glUniform1i(this_00,GVar6,4);
            glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vao);
            iVar8 = 0x10;
            glu::CallLogWrapper::glViewport(this_00,0,0,0x10,0x10);
            glu::CallLogWrapper::glDrawArrays(this_00,5,0,4);
            glu::CallLogWrapper::glActiveTexture(this_00,0x84c0);
            glu::CallLogWrapper::glBindTexture(this_00,0x9100,textures_3[0]);
            glu::CallLogWrapper::glActiveTexture(this_00,0x84c1);
            glu::CallLogWrapper::glBindTexture(this_00,0x9102,textures_3[1]);
            glu::CallLogWrapper::glUseProgram(this_00,program);
            GVar6 = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"g_sampler_2dms");
            glu::CallLogWrapper::glUniform1i(this_00,GVar6,0);
            GVar6 = glu::CallLogWrapper::glGetUniformLocation
                              (this_00,program,"g_sampler_2dms_array");
            glu::CallLogWrapper::glUniform1i(this_00,GVar6,1);
            glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vao);
            glu::CallLogWrapper::glViewport(this_00,0,0,0x10,0x10);
            glu::CallLogWrapper::glMemoryBarrier(this_00,0x20);
            glu::CallLogWrapper::glDrawArrays(this_00,5,0,4);
            os.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                 (_func_int **)0x3f80000000000000;
            os.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = 0x3f80000000000000;
            bVar4 = ShaderImageLoadStoreBase::ValidateReadBuffer
                              (&this->super_ShaderImageLoadStoreBase,0x10,0x10,(int)&os,iVar8,
                               pvVar13);
            if (bVar4) {
              glu::CallLogWrapper::glActiveTexture(this_00,0x84c0);
              glu::CallLogWrapper::glDeleteTextures(this_00,2,textures_3);
              glu::CallLogWrapper::glUseProgram(this_00,0);
              glu::CallLogWrapper::glDeleteProgram(this_00,GVar5);
              glu::CallLogWrapper::glDeleteProgram(this_00,program);
              return 0;
            }
          }
        }
        anon_unknown_0::Output
                  ("GL_TEXTURE_2D_MULTISAMPLE or GL_TEXTURE_2D_MULTISAMPLE_ARRAY target failed.\n");
        glu::CallLogWrapper::glActiveTexture(this_00,0x84c0);
        glu::CallLogWrapper::glDeleteTextures(this_00,2,textures_3);
        glu::CallLogWrapper::glUseProgram(this_00,0);
        glu::CallLogWrapper::glDeleteProgram(this_00,GVar5);
        glu::CallLogWrapper::glDeleteProgram(this_00,program);
      }
    }
  }
  return -1;
}

Assistant:

virtual long Run()
	{
		CreateFullViewportQuad(&m_vao, &m_vbo, NULL);

		if (!Write(GL_RGBA32F, vec4(-1.0f, 2.0f, 3.0f, -4.0f), vec4(-1.0f, 2.0f, 3.0f, -4.0f)))
			return ERROR;
		if (!Write(GL_RGBA32I, ivec4(1, -2, 3, -4), ivec4(1, -2, 3, -4)))
			return ERROR;
		if (!Write(GL_RGBA32UI, uvec4(1, 2, 3, 4), uvec4(1, 2, 3, 4)))
			return ERROR;

		if (!WriteCubeArray(GL_RGBA32F, vec4(-1.0f, 2.0f, 3.0f, -4.0f), vec4(-1.0f, 2.0f, 3.0f, -4.0f)))
			return ERROR;
		if (!WriteCubeArray(GL_RGBA32I, ivec4(1, -2, 3, -4), ivec4(1, -2, 3, -4)))
			return ERROR;
		if (!WriteCubeArray(GL_RGBA32UI, uvec4(1, 2, 3, 4), uvec4(1, 2, 3, 4)))
			return ERROR;

		if (SupportedSamples(4))
		{
			if (!WriteMS(GL_RGBA32F, vec4(-1.0f, 2.0f, 3.0f, -4.0f), vec4(-1.0f, 2.0f, 3.0f, -4.0f)))
				return ERROR;

			GLint isamples;
			glGetIntegerv(GL_MAX_INTEGER_SAMPLES, &isamples);
			if (isamples >= 4)
			{
				if (!WriteMS(GL_RGBA32I, ivec4(1, -2, 3, -4), ivec4(1, -2, 3, -4)))
					return ERROR;
				if (!WriteMS(GL_RGBA32UI, uvec4(1, 2, 3, 4), uvec4(1, 2, 3, 4)))
					return ERROR;
			}
		}
		return NO_ERROR;
	}